

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_8_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined6 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined4 uVar33;
  undefined6 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined4 uVar39;
  undefined6 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 (*pauVar84) [16];
  ulong *puVar85;
  undefined8 uVar86;
  undefined8 *in_RCX;
  ulong uVar87;
  ulong *puVar88;
  undefined8 *in_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong in_RSI;
  void *in_RDI;
  void *a;
  undefined8 *in_R8;
  short sVar89;
  short sVar90;
  ushort uVar91;
  ushort uVar97;
  ushort uVar98;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  ulong uVar93;
  undefined8 extraout_XMM0_Qa_09;
  undefined8 extraout_XMM0_Qa_10;
  undefined8 extraout_XMM0_Qa_11;
  undefined8 extraout_XMM0_Qa_12;
  ushort uVar99;
  byte bVar100;
  byte bVar104;
  ushort uVar101;
  byte bVar105;
  byte bVar107;
  ushort uVar106;
  byte bVar108;
  byte bVar110;
  ushort uVar109;
  byte bVar111;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ulong uVar92;
  ulong uVar102;
  undefined1 auVar96 [16];
  ulong uVar103;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  byte bVar113;
  ushort uVar112;
  __m128i alVar114;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i v_03;
  __m128i v_04;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i p1p0;
  __m128i q1q0;
  __m128i q3;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  __m128i workp_shft2;
  __m128i workp_shft1;
  __m128i workp_d;
  __m128i workp_c;
  __m128i workp_b;
  __m128i workp_a;
  __m128i four;
  __m128i work;
  __m128i abs_p1p0;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i ff;
  __m128i fe;
  __m128i one;
  __m128i pq2;
  __m128i opq2;
  __m128i work_pq;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i p1p0_1;
  __m128i q1q0_1;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i q3p3;
  __m128i q3_16;
  __m128i p3_16;
  __m128i q1_16;
  __m128i q0_16;
  __m128i p0_16;
  __m128i p1_16;
  __m128i q2_16;
  __m128i p2_16;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i zero;
  __m128i ff_1;
  __m128i t80;
  __m128i t3t4;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_1;
  __m128i filter2filter1;
  __m128i filter;
  undefined1 local_1438 [16];
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  ulong local_1408 [2];
  ulong local_13f8 [2];
  undefined8 local_13e8 [2];
  undefined1 local_13d8 [16];
  undefined8 local_13c8 [2];
  undefined8 local_13b8 [2];
  undefined8 local_13a8 [2];
  undefined8 local_1398 [2];
  undefined1 local_1388 [16];
  undefined8 local_1378 [5];
  uint local_134c;
  void *local_1348;
  ushort local_1328;
  ushort uStack_1326;
  ushort uStack_1324;
  ushort uStack_1322;
  short sStack_1320;
  short sStack_131e;
  short sStack_131c;
  short sStack_131a;
  ushort local_1318;
  ushort uStack_1316;
  ushort uStack_1314;
  ushort uStack_1312;
  short sStack_1310;
  short sStack_130e;
  short sStack_130c;
  short sStack_130a;
  ushort local_1308;
  ushort uStack_1306;
  ushort uStack_1304;
  ushort uStack_1302;
  short sStack_1300;
  short sStack_12fe;
  short sStack_12fc;
  short sStack_12fa;
  undefined8 local_12f8;
  undefined8 uStack_12f0;
  short local_12e8;
  short sStack_12e6;
  short sStack_12e4;
  short sStack_12e2;
  short sStack_12e0;
  short sStack_12de;
  short sStack_12dc;
  short sStack_12da;
  short local_12d8;
  short sStack_12d6;
  short sStack_12d4;
  short sStack_12d2;
  short sStack_12d0;
  short sStack_12ce;
  short sStack_12cc;
  short sStack_12ca;
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  byte local_12b8;
  byte bStack_12b7;
  byte bStack_12b6;
  byte bStack_12b5;
  byte bStack_12b4;
  byte bStack_12b3;
  byte bStack_12b2;
  byte bStack_12b1;
  byte bStack_12b0;
  byte bStack_12af;
  byte bStack_12ae;
  byte bStack_12ad;
  byte bStack_12ac;
  byte bStack_12ab;
  byte bStack_12aa;
  byte bStack_12a9;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined1 local_1298 [16];
  undefined1 local_1288 [16];
  undefined1 local_1278 [16];
  undefined1 local_1268;
  undefined1 uStack_1267;
  undefined1 uStack_1266;
  undefined1 uStack_1265;
  undefined1 uStack_1264;
  undefined1 uStack_1263;
  undefined1 uStack_1262;
  undefined1 uStack_1261;
  undefined1 uStack_1260;
  undefined1 uStack_125f;
  undefined1 uStack_125e;
  undefined1 uStack_125d;
  undefined1 uStack_125c;
  undefined1 uStack_125b;
  undefined1 uStack_125a;
  undefined1 uStack_1259;
  ulong local_1258;
  ulong uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  ulong local_1238;
  ulong uStack_1230;
  char local_1228;
  char cStack_1227;
  char cStack_1226;
  char cStack_1225;
  char cStack_1224;
  char cStack_1223;
  char cStack_1222;
  char cStack_1221;
  char cStack_1220;
  char cStack_121f;
  char cStack_121e;
  char cStack_121d;
  char cStack_121c;
  char cStack_121b;
  char cStack_121a;
  char cStack_1219;
  ulong local_1218;
  ulong uStack_1210;
  ulong local_1208;
  ulong uStack_1200;
  uint local_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  ulong local_11d8;
  ulong uStack_11d0;
  undefined4 local_11c8;
  undefined4 uStack_11c4;
  undefined4 uStack_11c0;
  undefined4 uStack_11bc;
  undefined4 local_11b8;
  undefined4 uStack_11b4;
  undefined4 uStack_11b0;
  undefined4 uStack_11ac;
  undefined4 local_11a8;
  undefined4 uStack_11a4;
  undefined4 uStack_11a0;
  undefined4 uStack_119c;
  char local_1198;
  char cStack_1197;
  char cStack_1196;
  char cStack_1195;
  char cStack_1194;
  char cStack_1193;
  char cStack_1192;
  char cStack_1191;
  char cStack_1190;
  char cStack_118f;
  char cStack_118e;
  char cStack_118d;
  char cStack_118c;
  char cStack_118b;
  char cStack_118a;
  char cStack_1189;
  char local_1188;
  char cStack_1187;
  char cStack_1186;
  char cStack_1185;
  char cStack_1184;
  char cStack_1183;
  char cStack_1182;
  char cStack_1181;
  char cStack_1180;
  char cStack_117f;
  char cStack_117e;
  char cStack_117d;
  char cStack_117c;
  char cStack_117b;
  char cStack_117a;
  char cStack_1179;
  undefined4 local_1178;
  undefined4 uStack_1174;
  undefined4 uStack_1170;
  undefined4 uStack_116c;
  undefined1 local_1168;
  char cStack_1167;
  undefined1 uStack_1166;
  char cStack_1165;
  undefined1 uStack_1164;
  char cStack_1163;
  undefined1 uStack_1162;
  char cStack_1161;
  undefined1 uStack_1160;
  char cStack_115f;
  undefined1 uStack_115e;
  char cStack_115d;
  undefined1 uStack_115c;
  char cStack_115b;
  undefined1 uStack_115a;
  char cStack_1159;
  undefined1 local_1158;
  char cStack_1157;
  undefined1 uStack_1156;
  char cStack_1155;
  undefined1 uStack_1154;
  char cStack_1153;
  undefined1 uStack_1152;
  char cStack_1151;
  undefined1 uStack_1150;
  char cStack_114f;
  undefined1 uStack_114e;
  char cStack_114d;
  undefined1 uStack_114c;
  char cStack_114b;
  undefined1 uStack_114a;
  char cStack_1149;
  undefined1 local_1148;
  char cStack_1147;
  undefined1 uStack_1146;
  char cStack_1145;
  undefined1 uStack_1144;
  char cStack_1143;
  undefined1 uStack_1142;
  char cStack_1141;
  undefined1 uStack_1140;
  char cStack_113f;
  undefined1 uStack_113e;
  char cStack_113d;
  undefined1 uStack_113c;
  char cStack_113b;
  undefined1 uStack_113a;
  char cStack_1139;
  undefined1 local_1138;
  char cStack_1137;
  undefined1 uStack_1136;
  char cStack_1135;
  undefined1 uStack_1134;
  char cStack_1133;
  undefined1 uStack_1132;
  char cStack_1131;
  undefined1 uStack_1130;
  char cStack_112f;
  undefined1 uStack_112e;
  char cStack_112d;
  undefined1 uStack_112c;
  char cStack_112b;
  undefined1 uStack_112a;
  char cStack_1129;
  undefined1 local_1128;
  char cStack_1127;
  undefined1 uStack_1126;
  char cStack_1125;
  undefined1 uStack_1124;
  char cStack_1123;
  undefined1 uStack_1122;
  char cStack_1121;
  undefined1 uStack_1120;
  char cStack_111f;
  undefined1 uStack_111e;
  char cStack_111d;
  undefined1 uStack_111c;
  char cStack_111b;
  undefined1 uStack_111a;
  char cStack_1119;
  undefined1 local_1118;
  char cStack_1117;
  undefined1 uStack_1116;
  char cStack_1115;
  undefined1 uStack_1114;
  char cStack_1113;
  undefined1 uStack_1112;
  char cStack_1111;
  undefined1 uStack_1110;
  char cStack_110f;
  undefined1 uStack_110e;
  char cStack_110d;
  undefined1 uStack_110c;
  char cStack_110b;
  undefined1 uStack_110a;
  char cStack_1109;
  undefined1 local_1108;
  char cStack_1107;
  undefined1 uStack_1106;
  char cStack_1105;
  undefined1 uStack_1104;
  char cStack_1103;
  undefined1 uStack_1102;
  char cStack_1101;
  undefined1 uStack_1100;
  char cStack_10ff;
  undefined1 uStack_10fe;
  char cStack_10fd;
  undefined1 uStack_10fc;
  char cStack_10fb;
  undefined1 uStack_10fa;
  char cStack_10f9;
  undefined1 local_10f8;
  char cStack_10f7;
  undefined1 uStack_10f6;
  char cStack_10f5;
  undefined1 uStack_10f4;
  char cStack_10f3;
  undefined1 uStack_10f2;
  char cStack_10f1;
  undefined1 uStack_10f0;
  char cStack_10ef;
  undefined1 uStack_10ee;
  char cStack_10ed;
  undefined1 uStack_10ec;
  char cStack_10eb;
  undefined1 uStack_10ea;
  char cStack_10e9;
  undefined1 local_10e8 [16];
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined1 local_10c8 [16];
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 (*local_10a0) [16];
  undefined1 (*local_1098) [16];
  undefined1 (*local_1090) [16];
  ulong *local_1088;
  ulong *local_1080;
  undefined8 *local_1078;
  undefined8 *local_1070;
  undefined8 *local_1068;
  undefined8 *local_1060;
  undefined1 (*local_1058) [16];
  undefined1 (*local_1050) [16];
  undefined8 *local_1048;
  undefined8 *local_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  ulong local_1028;
  ulong uStack_1020;
  undefined8 local_1018;
  ulong uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  ulong local_fe8;
  ulong uStack_fe0;
  undefined8 local_fd8;
  ulong uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined4 local_fa8;
  undefined4 uStack_fa4;
  undefined4 local_f98;
  undefined4 uStack_f94;
  undefined4 local_f88;
  undefined4 uStack_f84;
  undefined4 local_f78;
  undefined4 uStack_f74;
  undefined4 local_f68;
  undefined4 uStack_f64;
  undefined4 local_f58;
  undefined4 uStack_f54;
  undefined4 local_f48;
  undefined4 uStack_f44;
  undefined4 local_f38;
  undefined4 uStack_f34;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined8 local_ee8;
  undefined8 uStack_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 uStack_e70;
  undefined8 local_e68;
  undefined8 uStack_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  ulong local_dc8;
  undefined8 uStack_dc0;
  ulong local_db8;
  undefined8 uStack_db0;
  undefined1 local_d9a;
  undefined1 local_d99;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  ulong uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  ulong local_cf8;
  ulong uStack_cf0;
  ulong local_ce8;
  ulong uStack_ce0;
  undefined1 local_cd8 [16];
  undefined1 local_cc8 [16];
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  byte local_c98;
  byte bStack_c97;
  byte bStack_c96;
  byte bStack_c95;
  byte bStack_c94;
  byte bStack_c93;
  byte bStack_c92;
  byte bStack_c91;
  byte bStack_c90;
  byte bStack_c8f;
  byte bStack_c8e;
  byte bStack_c8d;
  byte bStack_c8c;
  byte bStack_c8b;
  byte bStack_c8a;
  byte bStack_c89;
  byte local_c88;
  byte bStack_c87;
  byte bStack_c86;
  byte bStack_c85;
  byte bStack_c84;
  byte bStack_c83;
  byte bStack_c82;
  byte bStack_c81;
  byte bStack_c80;
  byte bStack_c7f;
  byte bStack_c7e;
  byte bStack_c7d;
  byte bStack_c7c;
  byte bStack_c7b;
  byte bStack_c7a;
  byte bStack_c79;
  undefined1 local_c78 [16];
  undefined1 local_c68 [16];
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  byte local_c38;
  byte bStack_c37;
  byte bStack_c36;
  byte bStack_c35;
  byte bStack_c34;
  byte bStack_c33;
  byte bStack_c32;
  byte bStack_c31;
  byte bStack_c30;
  byte bStack_c2f;
  byte bStack_c2e;
  byte bStack_c2d;
  byte bStack_c2c;
  byte bStack_c2b;
  byte bStack_c2a;
  byte bStack_c29;
  byte local_c28;
  byte bStack_c27;
  byte bStack_c26;
  byte bStack_c25;
  byte bStack_c24;
  byte bStack_c23;
  byte bStack_c22;
  byte bStack_c21;
  byte bStack_c20;
  byte bStack_c1f;
  byte bStack_c1e;
  byte bStack_c1d;
  byte bStack_c1c;
  byte bStack_c1b;
  byte bStack_c1a;
  byte bStack_c19;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined8 local_bf8;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  ulong uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined4 local_b8c;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined4 local_b6c;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined4 local_b4c;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined4 local_b2c;
  undefined8 local_b28;
  undefined8 uStack_b20;
  ulong local_b18;
  ulong uStack_b10;
  ulong local_b08;
  ulong uStack_b00;
  ulong local_af8;
  ulong uStack_af0;
  ulong local_ae8;
  ulong uStack_ae0;
  ulong local_ad8;
  ulong uStack_ad0;
  ulong local_ac8;
  ulong uStack_ac0;
  ulong local_ab8;
  ulong uStack_ab0;
  ulong local_aa8;
  ulong uStack_aa0;
  ulong local_a98;
  ulong uStack_a90;
  ulong local_a88;
  ulong uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined1 local_a28 [16];
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  ulong local_9f8;
  ulong uStack_9f0;
  char local_9e8;
  char cStack_9e7;
  char cStack_9e6;
  char cStack_9e5;
  char cStack_9e4;
  char cStack_9e3;
  char cStack_9e2;
  char cStack_9e1;
  char cStack_9e0;
  char cStack_9df;
  char cStack_9de;
  char cStack_9dd;
  char cStack_9dc;
  char cStack_9db;
  char cStack_9da;
  char cStack_9d9;
  ulong local_9d8;
  ulong uStack_9d0;
  char local_9c8;
  char cStack_9c7;
  char cStack_9c6;
  char cStack_9c5;
  char cStack_9c4;
  char cStack_9c3;
  char cStack_9c2;
  char cStack_9c1;
  char cStack_9c0;
  char cStack_9bf;
  char cStack_9be;
  char cStack_9bd;
  char cStack_9bc;
  char cStack_9bb;
  char cStack_9ba;
  char cStack_9b9;
  char local_9b8;
  char cStack_9b7;
  char cStack_9b6;
  char cStack_9b5;
  char cStack_9b4;
  char cStack_9b3;
  char cStack_9b2;
  char cStack_9b1;
  char cStack_9b0;
  char cStack_9af;
  char cStack_9ae;
  char cStack_9ad;
  char cStack_9ac;
  char cStack_9ab;
  char cStack_9aa;
  byte bStack_9a9;
  ulong local_9a8;
  ulong uStack_9a0;
  ulong local_998;
  ulong uStack_990;
  ulong local_988;
  ulong uStack_980;
  ulong local_978;
  ulong uStack_970;
  ulong local_968;
  ulong uStack_960;
  ulong local_958;
  ulong uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  ulong local_928;
  ulong uStack_920;
  ulong local_918;
  ulong uStack_910;
  ulong local_908;
  ulong uStack_900;
  ulong local_8f8;
  ulong uStack_8f0;
  undefined2 local_8da;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  short local_8a8;
  short sStack_8a6;
  short sStack_8a4;
  short sStack_8a2;
  short sStack_8a0;
  short sStack_89e;
  short sStack_89c;
  short sStack_89a;
  undefined8 local_898;
  undefined8 uStack_890;
  short local_888;
  short sStack_886;
  short sStack_884;
  short sStack_882;
  short sStack_880;
  short sStack_87e;
  short sStack_87c;
  short sStack_87a;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  undefined8 local_838;
  undefined8 uStack_830;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  short local_788;
  short sStack_786;
  short sStack_784;
  short sStack_782;
  short sStack_780;
  short sStack_77e;
  short sStack_77c;
  short sStack_77a;
  undefined8 local_778;
  undefined8 uStack_770;
  short local_768;
  short sStack_766;
  short sStack_764;
  short sStack_762;
  short sStack_760;
  short sStack_75e;
  short sStack_75c;
  short sStack_75a;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  short local_728;
  short sStack_726;
  short sStack_724;
  short sStack_722;
  short sStack_720;
  short sStack_71e;
  short sStack_71c;
  short sStack_71a;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  short local_6c8;
  short sStack_6c6;
  short sStack_6c4;
  short sStack_6c2;
  short sStack_6c0;
  short sStack_6be;
  short sStack_6bc;
  short sStack_6ba;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  short local_688;
  short sStack_686;
  short sStack_684;
  short sStack_682;
  short sStack_680;
  short sStack_67e;
  short sStack_67c;
  short sStack_67a;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  short local_658;
  short sStack_656;
  short sStack_654;
  short sStack_652;
  short sStack_650;
  short sStack_64e;
  short sStack_64c;
  short sStack_64a;
  short local_648;
  short sStack_646;
  short sStack_644;
  short sStack_642;
  short sStack_640;
  short sStack_63e;
  short sStack_63c;
  short sStack_63a;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined1 local_4f8;
  undefined1 uStack_4f7;
  undefined1 uStack_4f6;
  undefined1 uStack_4f5;
  undefined1 uStack_4f4;
  undefined1 uStack_4f3;
  undefined1 uStack_4f2;
  undefined1 uStack_4f1;
  undefined1 uStack_4f0;
  undefined1 uStack_4ef;
  undefined1 uStack_4ee;
  undefined1 uStack_4ed;
  undefined1 uStack_4ec;
  undefined1 uStack_4eb;
  undefined1 uStack_4ea;
  undefined1 uStack_4e9;
  ulong local_4e8;
  ulong uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  ulong local_4c8;
  undefined8 uStack_4c0;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  ulong *local_468;
  ulong *local_460;
  undefined1 *local_458;
  undefined8 *local_450;
  ulong *local_448;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  ulong local_418;
  ulong uStack_410;
  undefined8 local_408;
  ulong uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  undefined8 local_3e8;
  ulong uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_389;
  ulong local_388;
  ulong uStack_380;
  ulong local_378;
  ulong uStack_370;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  ulong uStack_340;
  undefined1 local_338 [16];
  ulong local_328;
  ulong uStack_320;
  ulong local_318;
  ulong uStack_310;
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  undefined8 local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  ulong local_218;
  ulong uStack_210;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  undefined8 uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ulong local_148;
  ulong uStack_140;
  undefined1 local_138;
  undefined1 local_137;
  undefined1 local_136;
  undefined1 local_135;
  undefined1 local_134;
  undefined1 local_133;
  undefined1 local_132;
  undefined1 local_131;
  undefined1 local_130;
  undefined1 local_12f;
  undefined1 local_12e;
  undefined1 local_12d;
  undefined1 local_12c;
  undefined1 local_12b;
  undefined1 local_12a;
  undefined1 local_129;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  ulong local_e8;
  ulong uStack_e0;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  undefined1 local_c8;
  undefined1 local_c7;
  undefined1 local_c6;
  undefined1 local_c5;
  undefined1 local_c4;
  undefined1 local_c3;
  undefined1 local_c2;
  undefined1 local_c1;
  undefined1 local_c0;
  undefined1 local_bf;
  undefined1 local_be;
  undefined1 local_bd;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  longlong extraout_RDX;
  
  local_134c = (uint)in_RSI;
  local_1418._0_8_ = *in_RDX;
  local_1418._8_8_ = in_RDX[1];
  local_1428._0_8_ = *in_RCX;
  local_1428._8_8_ = in_RCX[1];
  local_1438._0_8_ = *in_R8;
  local_1438._8_8_ = in_R8[1];
  local_1348 = in_RDI;
  xx_loadl_32((void *)((long)in_RDI - (long)(int)(local_134c << 2)));
  local_1378[0] = extraout_XMM0_Qa;
  xx_loadl_32((void *)((long)local_1348 - (long)(int)(local_134c * 3)));
  local_1388._0_8_ = extraout_XMM0_Qa_00;
  xx_loadl_32((void *)((long)local_1348 - (long)(int)(local_134c * 2)));
  local_1398[0] = extraout_XMM0_Qa_01;
  xx_loadl_32((void *)((long)local_1348 - (long)(int)local_134c));
  local_13a8[0] = extraout_XMM0_Qa_02;
  xx_loadl_32(local_1348);
  local_13b8[0] = extraout_XMM0_Qa_03;
  xx_loadl_32((void *)((long)local_1348 + (long)(int)local_134c));
  local_13c8[0] = extraout_XMM0_Qa_04;
  xx_loadl_32((void *)((long)local_1348 + (long)(int)(local_134c * 2)));
  uVar87 = (ulong)local_134c;
  a = (void *)((long)local_1348 + (long)(int)(local_134c * 3));
  local_13d8._0_8_ = extraout_XMM0_Qa_05;
  alVar114 = xx_loadl_32(a);
  alVar114[0] = alVar114[1];
  local_1040 = local_1378;
  local_1048 = local_13e8;
  local_1050 = &local_1388;
  local_1058 = &local_13d8;
  local_1060 = local_1398;
  local_1068 = local_13c8;
  local_1070 = local_13a8;
  local_1078 = local_13b8;
  local_1080 = local_13f8;
  local_1088 = local_1408;
  local_1090 = &local_1418;
  local_1098 = &local_1428;
  local_10a0 = &local_1438;
  local_1038 = 0;
  uStack_1030 = 0;
  local_10b8 = 0;
  uStack_10b0 = 0;
  local_f38 = (undefined4)local_1378[0];
  uStack_f34 = (undefined4)((ulong)local_1378[0] >> 0x20);
  local_f48 = (undefined4)extraout_XMM0_Qa_06;
  uStack_f44 = (undefined4)((ulong)extraout_XMM0_Qa_06 >> 0x20);
  local_1178 = local_f38;
  uStack_1174 = local_f48;
  uStack_1170 = uStack_f34;
  uStack_116c = uStack_f44;
  local_f58 = (undefined4)local_1388._0_8_;
  uStack_f54 = SUB84(local_1388._0_8_,4);
  local_f68 = (undefined4)local_13d8._0_8_;
  uStack_f64 = SUB84(local_13d8._0_8_,4);
  local_11a8 = local_f58;
  uStack_11a4 = local_f68;
  uStack_11a0 = uStack_f54;
  uStack_119c = uStack_f64;
  local_f78 = (undefined4)local_1398[0];
  uStack_f74 = (undefined4)((ulong)local_1398[0] >> 0x20);
  local_f88 = (undefined4)local_13c8[0];
  uStack_f84 = (undefined4)((ulong)local_13c8[0] >> 0x20);
  local_11b8 = local_f78;
  uStack_11b4 = local_f88;
  uStack_11b0 = uStack_f74;
  uStack_11ac = uStack_f84;
  local_f98 = (undefined4)local_13a8[0];
  uStack_f94 = (undefined4)((ulong)local_13a8[0] >> 0x20);
  local_fa8 = (undefined4)local_13b8[0];
  uStack_fa4 = (undefined4)((ulong)local_13b8[0] >> 0x20);
  local_11c8 = local_f98;
  uStack_11c4 = local_fa8;
  uStack_11c0 = uStack_f94;
  uStack_11bc = uStack_fa4;
  local_fb8 = CONCAT44(local_fa8,local_f98);
  uStack_fb0 = CONCAT44(uStack_fa4,uStack_f94);
  local_fc8 = CONCAT44(local_f88,local_f78);
  uStack_fc0 = CONCAT44(uStack_f84,uStack_f74);
  local_11e8 = CONCAT44(local_f78,local_f98);
  uStack_11e0 = CONCAT44(local_f88,local_fa8);
  local_11d8 = uStack_11e0;
  uStack_11d0 = 0;
  local_d99 = 1;
  local_e9 = 1;
  local_ea = 1;
  local_eb = 1;
  local_ec = 1;
  local_ed = 1;
  local_ee = 1;
  local_ef = 1;
  local_f0 = 1;
  local_f1 = 1;
  local_f2 = 1;
  local_f3 = 1;
  local_f4 = 1;
  local_f5 = 1;
  local_f6 = 1;
  local_f7 = 1;
  local_f8 = 1;
  local_1248 = 0x101010101010101;
  uStack_1240 = 0x101010101010101;
  local_d9a = 0xfe;
  local_bd = 0xfe;
  local_be = 0xfe;
  local_bf = 0xfe;
  local_c0 = 0xfe;
  local_c1 = 0xfe;
  local_c2 = 0xfe;
  local_c3 = 0xfe;
  local_c4 = 0xfe;
  local_c5 = 0xfe;
  local_c6 = 0xfe;
  local_c7 = 0xfe;
  local_c8 = 0xfe;
  local_c9 = 0xfe;
  local_ca = 0xfe;
  local_cb = 0xfe;
  local_cc = 0xfe;
  local_1258 = 0xfefefefefefefefe;
  uStack_1250 = 0xfefefefefefefefe;
  local_1268 = 0xff;
  uStack_1267 = 0xff;
  uStack_1266 = 0xff;
  uStack_1265 = 0xff;
  uStack_1264 = 0xff;
  uStack_1263 = 0xff;
  uStack_1262 = 0xff;
  uStack_1261 = 0xff;
  uStack_1260 = 0xff;
  uStack_125f = 0xff;
  uStack_125e = 0xff;
  uStack_125d = 0xff;
  uStack_125c = 0xff;
  uStack_125b = 0xff;
  uStack_125a = 0xff;
  uStack_1259 = 0xff;
  alVar114[1] = uVar87;
  a_00[1] = in_RSI;
  a_00[0] = (longlong)a;
  local_cf8 = local_1258;
  uStack_cf0 = uStack_1250;
  local_ce8 = local_1258;
  uStack_ce0 = uStack_1250;
  local_108 = local_1248;
  uStack_100 = uStack_1240;
  local_e8 = local_1258;
  uStack_e0 = uStack_1250;
  alVar114 = abs_diff(a_00,alVar114);
  b[0] = alVar114[1];
  auVar94._8_8_ = extraout_XMM0_Qb;
  auVar94._0_8_ = extraout_XMM0_Qa_07;
  local_1298 = auVar94 >> 0x20;
  b[1] = uVar87;
  a_01[1] = in_RSI;
  a_01[0] = (longlong)a;
  local_12a8 = extraout_XMM0_Qa_07;
  uStack_12a0 = extraout_XMM0_Qb;
  alVar114 = abs_diff(a_01,b);
  b_00[0] = alVar114[1];
  local_1288._8_8_ = extraout_XMM0_Qb_00;
  local_1288._0_8_ = extraout_XMM0_Qa_08;
  local_be8 = local_12a8;
  uVar9 = local_be8;
  uStack_be0 = uStack_12a0;
  uVar12 = uStack_be0;
  local_bf8 = local_1298._0_8_;
  uVar7 = local_bf8;
  uStack_bf0 = local_1298._8_8_;
  uVar8 = uStack_bf0;
  local_be8._0_1_ = (byte)local_12a8;
  local_be8._1_1_ = (byte)((ulong)local_12a8 >> 8);
  local_be8._2_1_ = (byte)((ulong)local_12a8 >> 0x10);
  local_be8._3_1_ = (byte)((ulong)local_12a8 >> 0x18);
  local_be8._4_1_ = (byte)((ulong)local_12a8 >> 0x20);
  local_be8._5_1_ = (byte)((ulong)local_12a8 >> 0x28);
  local_be8._6_1_ = (byte)((ulong)local_12a8 >> 0x30);
  local_be8._7_1_ = (byte)((ulong)local_12a8 >> 0x38);
  uStack_be0._0_1_ = (byte)uStack_12a0;
  uStack_be0._1_1_ = (byte)((ulong)uStack_12a0 >> 8);
  uStack_be0._2_1_ = (byte)((ulong)uStack_12a0 >> 0x10);
  uStack_be0._3_1_ = (byte)((ulong)uStack_12a0 >> 0x18);
  uStack_be0._4_1_ = (byte)((ulong)uStack_12a0 >> 0x20);
  uStack_be0._5_1_ = (byte)((ulong)uStack_12a0 >> 0x28);
  uStack_be0._6_1_ = (byte)((ulong)uStack_12a0 >> 0x30);
  uStack_be0._7_1_ = (byte)((ulong)uStack_12a0 >> 0x38);
  local_bf8._0_1_ = local_1298[0];
  local_bf8._1_1_ = local_1298[1];
  local_bf8._2_1_ = local_1298[2];
  local_bf8._3_1_ = local_1298[3];
  local_bf8._4_1_ = local_1298[4];
  local_bf8._5_1_ = local_1298[5];
  local_bf8._6_1_ = local_1298[6];
  local_bf8._7_1_ = local_1298[7];
  uStack_bf0._0_1_ = local_1298[8];
  uStack_bf0._1_1_ = local_1298[9];
  uStack_bf0._2_1_ = local_1298[10];
  uStack_bf0._3_1_ = local_1298[0xb];
  uStack_bf0._4_1_ = local_1298[0xc];
  uStack_bf0._5_1_ = local_1298[0xd];
  uStack_bf0._6_1_ = local_1298[0xe];
  uStack_bf0._7_1_ = local_1298[0xf];
  local_10e8[1] =
       (local_be8._1_1_ < local_bf8._1_1_) * local_bf8._1_1_ |
       (local_be8._1_1_ >= local_bf8._1_1_) * local_be8._1_1_;
  local_10e8[0] =
       ((byte)local_be8 < (byte)local_bf8) * (byte)local_bf8 |
       ((byte)local_be8 >= (byte)local_bf8) * (byte)local_be8;
  local_10e8[2] =
       (local_be8._2_1_ < local_bf8._2_1_) * local_bf8._2_1_ |
       (local_be8._2_1_ >= local_bf8._2_1_) * local_be8._2_1_;
  local_10e8[3] =
       (local_be8._3_1_ < local_bf8._3_1_) * local_bf8._3_1_ |
       (local_be8._3_1_ >= local_bf8._3_1_) * local_be8._3_1_;
  local_10e8[4] =
       (local_be8._4_1_ < local_bf8._4_1_) * local_bf8._4_1_ |
       (local_be8._4_1_ >= local_bf8._4_1_) * local_be8._4_1_;
  local_10e8[5] =
       (local_be8._5_1_ < local_bf8._5_1_) * local_bf8._5_1_ |
       (local_be8._5_1_ >= local_bf8._5_1_) * local_be8._5_1_;
  local_10e8[6] =
       (local_be8._6_1_ < local_bf8._6_1_) * local_bf8._6_1_ |
       (local_be8._6_1_ >= local_bf8._6_1_) * local_be8._6_1_;
  local_10e8[7] =
       (local_be8._7_1_ < local_bf8._7_1_) * local_bf8._7_1_ |
       (local_be8._7_1_ >= local_bf8._7_1_) * local_be8._7_1_;
  local_10e8[8] =
       ((byte)uStack_be0 < (byte)uStack_bf0) * (byte)uStack_bf0 |
       ((byte)uStack_be0 >= (byte)uStack_bf0) * (byte)uStack_be0;
  local_10e8[9] =
       (uStack_be0._1_1_ < uStack_bf0._1_1_) * uStack_bf0._1_1_ |
       (uStack_be0._1_1_ >= uStack_bf0._1_1_) * uStack_be0._1_1_;
  local_10e8[10] =
       (uStack_be0._2_1_ < uStack_bf0._2_1_) * uStack_bf0._2_1_ |
       (uStack_be0._2_1_ >= uStack_bf0._2_1_) * uStack_be0._2_1_;
  local_10e8[0xb] =
       (uStack_be0._3_1_ < uStack_bf0._3_1_) * uStack_bf0._3_1_ |
       (uStack_be0._3_1_ >= uStack_bf0._3_1_) * uStack_be0._3_1_;
  local_10e8[0xc] =
       (uStack_be0._4_1_ < uStack_bf0._4_1_) * uStack_bf0._4_1_ |
       (uStack_be0._4_1_ >= uStack_bf0._4_1_) * uStack_be0._4_1_;
  local_10e8[0xd] =
       (uStack_be0._5_1_ < uStack_bf0._5_1_) * uStack_bf0._5_1_ |
       (uStack_be0._5_1_ >= uStack_bf0._5_1_) * uStack_be0._5_1_;
  local_10e8[0xe] =
       (uStack_be0._6_1_ < uStack_bf0._6_1_) * uStack_bf0._6_1_ |
       (uStack_be0._6_1_ >= uStack_bf0._6_1_) * uStack_be0._6_1_;
  local_10e8[0xf] =
       (uStack_be0._7_1_ < uStack_bf0._7_1_) * uStack_bf0._7_1_ |
       (uStack_be0._7_1_ >= uStack_bf0._7_1_) * uStack_be0._7_1_;
  local_a18 = *(undefined8 *)*local_10a0;
  uStack_a10 = *(undefined8 *)(*local_10a0 + 8);
  local_a08 = local_10e8._0_8_;
  uStack_a00 = local_10e8._8_8_;
  auVar71._8_8_ = local_10e8._8_8_;
  auVar71._0_8_ = local_10e8._0_8_;
  auVar94 = psubusb(auVar71,*local_10a0);
  local_10d8 = auVar94._0_8_;
  uStack_10d0 = auVar94._8_8_;
  local_d08 = local_10d8;
  uVar5 = local_d08;
  uStack_d00 = uStack_10d0;
  uVar6 = uStack_d00;
  local_d18 = local_10b8;
  uVar86 = local_d18;
  uStack_d10 = uStack_10b0;
  uVar4 = uStack_d10;
  local_d08._0_1_ = auVar94[0];
  local_d08._1_1_ = auVar94[1];
  local_d08._2_1_ = auVar94[2];
  local_d08._3_1_ = auVar94[3];
  local_d08._4_1_ = auVar94[4];
  local_d08._5_1_ = auVar94[5];
  local_d08._6_1_ = auVar94[6];
  local_d08._7_1_ = auVar94[7];
  uStack_d00._0_1_ = auVar94[8];
  uStack_d00._1_1_ = auVar94[9];
  uStack_d00._2_1_ = auVar94[10];
  uStack_d00._3_1_ = auVar94[0xb];
  uStack_d00._4_1_ = auVar94[0xc];
  uStack_d00._5_1_ = auVar94[0xd];
  uStack_d00._6_1_ = auVar94[0xe];
  uStack_d00._7_1_ = auVar94[0xf];
  local_d18._0_1_ = (char)local_10b8;
  local_d18._1_1_ = (char)((ulong)local_10b8 >> 8);
  local_d18._2_1_ = (char)((ulong)local_10b8 >> 0x10);
  local_d18._3_1_ = (char)((ulong)local_10b8 >> 0x18);
  local_d18._4_1_ = (char)((ulong)local_10b8 >> 0x20);
  local_d18._5_1_ = (char)((ulong)local_10b8 >> 0x28);
  local_d18._6_1_ = (char)((ulong)local_10b8 >> 0x30);
  local_d18._7_1_ = (char)((ulong)local_10b8 >> 0x38);
  uStack_d10._0_1_ = (char)uStack_10b0;
  uStack_d10._1_1_ = (char)((ulong)uStack_10b0 >> 8);
  uStack_d10._2_1_ = (char)((ulong)uStack_10b0 >> 0x10);
  uStack_d10._3_1_ = (char)((ulong)uStack_10b0 >> 0x18);
  uStack_d10._4_1_ = (char)((ulong)uStack_10b0 >> 0x20);
  uStack_d10._5_1_ = (char)((ulong)uStack_10b0 >> 0x28);
  uStack_d10._6_1_ = (char)((ulong)uStack_10b0 >> 0x30);
  uStack_d10._7_1_ = (char)((ulong)uStack_10b0 >> 0x38);
  local_9c8 = -((char)local_d08 == (char)local_d18);
  cStack_9c7 = -(local_d08._1_1_ == local_d18._1_1_);
  cStack_9c6 = -(local_d08._2_1_ == local_d18._2_1_);
  cStack_9c5 = -(local_d08._3_1_ == local_d18._3_1_);
  cStack_9c4 = -(local_d08._4_1_ == local_d18._4_1_);
  cStack_9c3 = -(local_d08._5_1_ == local_d18._5_1_);
  cStack_9c2 = -(local_d08._6_1_ == local_d18._6_1_);
  cStack_9c1 = -(local_d08._7_1_ == local_d18._7_1_);
  cStack_9c0 = -((char)uStack_d00 == (char)uStack_d10);
  cStack_9bf = -(uStack_d00._1_1_ == uStack_d10._1_1_);
  cStack_9be = -(uStack_d00._2_1_ == uStack_d10._2_1_);
  cStack_9bd = -(uStack_d00._3_1_ == uStack_d10._3_1_);
  cStack_9bc = -(uStack_d00._4_1_ == uStack_d10._4_1_);
  cStack_9bb = -(uStack_d00._5_1_ == uStack_d10._5_1_);
  cStack_9ba = -(uStack_d00._6_1_ == uStack_d10._6_1_);
  cStack_9b9 = -(uStack_d00._7_1_ == uStack_d10._7_1_);
  local_9d8 = CONCAT17(uStack_1261,
                       CONCAT16(uStack_1262,
                                CONCAT15(uStack_1263,
                                         CONCAT14(uStack_1264,
                                                  CONCAT13(uStack_1265,
                                                           CONCAT12(uStack_1266,
                                                                    CONCAT11(uStack_1267,local_1268)
                                                                   ))))));
  uStack_9d0 = CONCAT17(uStack_1259,
                        CONCAT16(uStack_125a,
                                 CONCAT15(uStack_125b,
                                          CONCAT14(uStack_125c,
                                                   CONCAT13(uStack_125d,
                                                            CONCAT12(uStack_125e,
                                                                     CONCAT11(uStack_125f,
                                                                              uStack_1260)))))));
  local_fe8 = CONCAT17(cStack_9c1,
                       CONCAT16(cStack_9c2,
                                CONCAT15(cStack_9c3,
                                         CONCAT14(cStack_9c4,
                                                  CONCAT13(cStack_9c5,
                                                           CONCAT12(cStack_9c6,
                                                                    CONCAT11(cStack_9c7,local_9c8)))
                                                 )))) ^ local_9d8;
  uStack_fe0 = CONCAT17(cStack_9b9,
                        CONCAT16(cStack_9ba,
                                 CONCAT15(cStack_9bb,
                                          CONCAT14(cStack_9bc,
                                                   CONCAT13(cStack_9bd,
                                                            CONCAT12(cStack_9be,
                                                                     CONCAT11(cStack_9bf,cStack_9c0)
                                                                    )))))) ^ uStack_9d0;
  local_fd8._0_4_ = (undefined4)local_fe8;
  local_fd8._4_4_ = (undefined4)(local_fe8 >> 0x20);
  local_10d8._4_4_ = (undefined4)local_fd8;
  local_10d8._0_4_ = (undefined4)local_fd8;
  uStack_10d0._0_4_ = local_fd8._4_4_;
  uStack_10d0._4_4_ = local_fd8._4_4_;
  auVar67._8_8_ = extraout_XMM0_Qb_00;
  auVar67._0_8_ = extraout_XMM0_Qa_08;
  auVar95._8_8_ = extraout_XMM0_Qb_00;
  auVar95._0_8_ = extraout_XMM0_Qa_08;
  auVar95 = paddusb(auVar67,auVar95);
  local_1278._0_8_ = local_1288._4_8_;
  uStack_a80 = extraout_XMM0_Qb_00 >> 0x20;
  local_a88 = local_1278._0_8_;
  local_a98 = local_1258;
  uStack_a90 = uStack_1250;
  uVar92 = local_1278._0_8_ & local_1258;
  uVar102 = uStack_a80 & uStack_1250;
  local_b2c = 1;
  local_b28._0_2_ = (ushort)uVar92;
  local_b28._2_2_ = (ushort)(uVar92 >> 0x10);
  local_b28._4_2_ = (ushort)(uVar92 >> 0x20);
  uStack_b20._0_2_ = (ushort)uVar102;
  uStack_b20._2_2_ = (ushort)(uVar102 >> 0x10);
  local_1278._2_2_ = local_b28._2_2_ >> 1;
  local_1278._0_2_ = (ushort)local_b28 >> 1;
  local_1278._4_2_ = local_b28._4_2_ >> 1;
  local_1278._6_2_ = (ushort)(uVar92 >> 0x31);
  local_1278._8_2_ = (ushort)uStack_b20 >> 1;
  local_1278._10_2_ = uStack_b20._2_2_ >> 1;
  local_1278._12_4_ = 0;
  auVar94 = local_1278;
  local_1288._0_8_ = auVar95._0_8_;
  local_1288._8_8_ = auVar95._8_8_;
  local_1278._12_4_ = 0;
  local_bc8 = local_1288._0_8_;
  uStack_bc0 = local_1288._8_8_;
  local_bd8 = local_1278._0_8_;
  uStack_bd0 = local_1278._8_8_;
  auVar96._8_4_ = local_1278._8_4_;
  auVar96._0_8_ = local_1278._0_8_;
  auVar96._12_4_ = 0;
  local_a28 = paddusb(auVar95,auVar96);
  local_a38 = *(undefined8 *)*local_1090;
  uStack_a30 = *(undefined8 *)(*local_1090 + 8);
  auVar96 = psubusb(local_a28,*local_1090);
  local_10c8._0_8_ = auVar96._0_8_;
  local_10c8._8_8_ = auVar96._8_8_;
  local_ff8 = local_10c8._0_8_;
  uVar1 = local_ff8;
  uStack_ff0 = local_10c8._8_8_;
  local_1008 = local_10b8;
  uStack_1000 = uStack_10b0;
  local_ff8._0_4_ = auVar96._0_4_;
  local_ff8._4_4_ = auVar96._4_4_;
  local_1008._0_4_ = (undefined4)local_10b8;
  local_1008._4_4_ = (undefined4)((ulong)local_10b8 >> 0x20);
  local_10c8._4_4_ = (undefined4)local_1008;
  local_10c8._0_4_ = (undefined4)local_ff8;
  local_10c8._8_4_ = local_ff8._4_4_;
  local_10c8._12_4_ = local_1008._4_4_;
  local_d28 = local_10c8._0_8_;
  uVar2 = local_d28;
  uStack_d20 = local_10c8._8_8_;
  uVar3 = uStack_d20;
  local_d38 = local_10b8;
  uStack_d30 = uStack_10b0;
  local_d28._0_1_ = auVar96[0];
  local_d28._1_1_ = auVar96[1];
  local_d28._2_1_ = auVar96[2];
  local_d28._3_1_ = auVar96[3];
  uStack_d20._0_1_ = auVar96[4];
  uStack_d20._1_1_ = auVar96[5];
  uStack_d20._2_1_ = auVar96[6];
  uStack_d20._3_1_ = auVar96[7];
  local_9e8 = -((char)local_d28 == (char)local_d18);
  cStack_9e7 = -(local_d28._1_1_ == local_d18._1_1_);
  cStack_9e6 = -(local_d28._2_1_ == local_d18._2_1_);
  cStack_9e5 = -(local_d28._3_1_ == local_d18._3_1_);
  cStack_9e4 = -((char)local_d18 == local_d18._4_1_);
  cStack_9e3 = -(local_d18._1_1_ == local_d18._5_1_);
  cStack_9e2 = -(local_d18._2_1_ == local_d18._6_1_);
  cStack_9e1 = -(local_d18._3_1_ == local_d18._7_1_);
  cStack_9e0 = -((char)uStack_d20 == (char)uStack_d10);
  cStack_9df = -(uStack_d20._1_1_ == uStack_d10._1_1_);
  cStack_9de = -(uStack_d20._2_1_ == uStack_d10._2_1_);
  cStack_9dd = -(uStack_d20._3_1_ == uStack_d10._3_1_);
  cStack_9dc = -(local_d18._4_1_ == uStack_d10._4_1_);
  cStack_9db = -(local_d18._5_1_ == uStack_d10._5_1_);
  cStack_9da = -(local_d18._6_1_ == uStack_d10._6_1_);
  cStack_9d9 = -(local_d18._7_1_ == uStack_d10._7_1_);
  local_9f8 = CONCAT17(uStack_1261,
                       CONCAT16(uStack_1262,
                                CONCAT15(uStack_1263,
                                         CONCAT14(uStack_1264,
                                                  CONCAT13(uStack_1265,
                                                           CONCAT12(uStack_1266,
                                                                    CONCAT11(uStack_1267,local_1268)
                                                                   ))))));
  uStack_9f0 = CONCAT17(uStack_1259,
                        CONCAT16(uStack_125a,
                                 CONCAT15(uStack_125b,
                                          CONCAT14(uStack_125c,
                                                   CONCAT13(uStack_125d,
                                                            CONCAT12(uStack_125e,
                                                                     CONCAT11(uStack_125f,
                                                                              uStack_1260)))))));
  uVar93 = CONCAT17(cStack_9e1,
                    CONCAT16(cStack_9e2,
                             CONCAT15(cStack_9e3,
                                      CONCAT14(cStack_9e4,
                                               CONCAT13(cStack_9e5,
                                                        CONCAT12(cStack_9e6,
                                                                 CONCAT11(cStack_9e7,local_9e8))))))
                   ) ^ local_9f8;
  uVar103 = CONCAT17(cStack_9d9,
                     CONCAT16(cStack_9da,
                              CONCAT15(cStack_9db,
                                       CONCAT14(cStack_9dc,
                                                CONCAT13(cStack_9dd,
                                                         CONCAT12(cStack_9de,
                                                                  CONCAT11(cStack_9df,cStack_9e0))))
                                      ))) ^ uStack_9f0;
  local_c08 = local_12a8;
  uStack_c00 = uStack_12a0;
  local_c18._0_1_ = (byte)uVar93;
  local_c18._1_1_ = (byte)(uVar93 >> 8);
  local_c18._2_1_ = (byte)(uVar93 >> 0x10);
  local_c18._3_1_ = (byte)(uVar93 >> 0x18);
  local_c18._4_1_ = (byte)(uVar93 >> 0x20);
  local_c18._5_1_ = (byte)(uVar93 >> 0x28);
  local_c18._6_1_ = (byte)(uVar93 >> 0x30);
  local_c18._7_1_ = (byte)(uVar93 >> 0x38);
  uStack_c10._0_1_ = (byte)uVar103;
  uStack_c10._1_1_ = (byte)(uVar103 >> 8);
  uStack_c10._2_1_ = (byte)(uVar103 >> 0x10);
  uStack_c10._3_1_ = (byte)(uVar103 >> 0x18);
  uStack_c10._4_1_ = (byte)(uVar103 >> 0x20);
  uStack_c10._5_1_ = (byte)(uVar103 >> 0x28);
  uStack_c10._6_1_ = (byte)(uVar103 >> 0x30);
  uStack_c10._7_1_ = (byte)(uVar103 >> 0x38);
  local_10c8[1] =
       (local_be8._1_1_ < local_c18._1_1_) * local_c18._1_1_ |
       (local_be8._1_1_ >= local_c18._1_1_) * local_be8._1_1_;
  local_10c8[0] =
       ((byte)local_be8 < (byte)local_c18) * (byte)local_c18 |
       ((byte)local_be8 >= (byte)local_c18) * (byte)local_be8;
  local_10c8[2] =
       (local_be8._2_1_ < local_c18._2_1_) * local_c18._2_1_ |
       (local_be8._2_1_ >= local_c18._2_1_) * local_be8._2_1_;
  local_10c8[3] =
       (local_be8._3_1_ < local_c18._3_1_) * local_c18._3_1_ |
       (local_be8._3_1_ >= local_c18._3_1_) * local_be8._3_1_;
  local_10c8[4] =
       (local_be8._4_1_ < local_c18._4_1_) * local_c18._4_1_ |
       (local_be8._4_1_ >= local_c18._4_1_) * local_be8._4_1_;
  local_10c8[5] =
       (local_be8._5_1_ < local_c18._5_1_) * local_c18._5_1_ |
       (local_be8._5_1_ >= local_c18._5_1_) * local_be8._5_1_;
  local_10c8[6] =
       (local_be8._6_1_ < local_c18._6_1_) * local_c18._6_1_ |
       (local_be8._6_1_ >= local_c18._6_1_) * local_be8._6_1_;
  local_10c8[7] =
       (local_be8._7_1_ < local_c18._7_1_) * local_c18._7_1_ |
       (local_be8._7_1_ >= local_c18._7_1_) * local_be8._7_1_;
  local_10c8[8] =
       ((byte)uStack_be0 < (byte)uStack_c10) * (byte)uStack_c10 |
       ((byte)uStack_be0 >= (byte)uStack_c10) * (byte)uStack_be0;
  local_10c8[9] =
       (uStack_be0._1_1_ < uStack_c10._1_1_) * uStack_c10._1_1_ |
       (uStack_be0._1_1_ >= uStack_c10._1_1_) * uStack_be0._1_1_;
  local_10c8[10] =
       (uStack_be0._2_1_ < uStack_c10._2_1_) * uStack_c10._2_1_ |
       (uStack_be0._2_1_ >= uStack_c10._2_1_) * uStack_be0._2_1_;
  local_10c8[0xb] =
       (uStack_be0._3_1_ < uStack_c10._3_1_) * uStack_c10._3_1_ |
       (uStack_be0._3_1_ >= uStack_c10._3_1_) * uStack_be0._3_1_;
  local_10c8[0xc] =
       (uStack_be0._4_1_ < uStack_c10._4_1_) * uStack_c10._4_1_ |
       (uStack_be0._4_1_ >= uStack_c10._4_1_) * uStack_be0._4_1_;
  local_10c8[0xd] =
       (uStack_be0._5_1_ < uStack_c10._5_1_) * uStack_c10._5_1_ |
       (uStack_be0._5_1_ >= uStack_c10._5_1_) * uStack_be0._5_1_;
  local_10c8[0xe] =
       (uStack_be0._6_1_ < uStack_c10._6_1_) * uStack_c10._6_1_ |
       (uStack_be0._6_1_ >= uStack_c10._6_1_) * uStack_be0._6_1_;
  local_10c8[0xf] =
       (uStack_be0._7_1_ < uStack_c10._7_1_) * uStack_c10._7_1_ |
       (uStack_be0._7_1_ >= uStack_c10._7_1_) * uStack_be0._7_1_;
  b_00[1] = uVar87;
  a_02[1] = in_RSI;
  a_02[0] = (longlong)a;
  local_1288 = auVar95;
  local_1278 = auVar94;
  local_1008 = uVar86;
  local_ff8 = uVar1;
  local_fd8 = local_fe8;
  uStack_fd0 = uStack_fe0;
  local_d28 = uVar2;
  uStack_d20 = uVar3;
  local_d18 = uVar86;
  uStack_d10 = uVar4;
  local_d08 = uVar5;
  uStack_d00 = uVar6;
  local_c18 = uVar93;
  uStack_c10 = uVar103;
  local_bf8 = uVar7;
  uStack_bf0 = uVar8;
  local_be8 = uVar9;
  uStack_be0 = uVar12;
  local_b28 = uVar92;
  uStack_b20 = uVar102;
  alVar114 = abs_diff(a_02,b_00);
  b_01[0] = alVar114[1];
  b_01[1] = uVar87;
  a_03[1] = in_RSI;
  a_03[0] = (longlong)a;
  abs_diff(a_03,b_01);
  puVar88 = local_1080;
  local_c28 = (byte)extraout_XMM0_Qa_09;
  bStack_c27 = (byte)((ulong)extraout_XMM0_Qa_09 >> 8);
  bStack_c26 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x10);
  bStack_c25 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x18);
  bStack_c24 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x20);
  bStack_c23 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x28);
  bStack_c22 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x30);
  bStack_c21 = (byte)((ulong)extraout_XMM0_Qa_09 >> 0x38);
  bStack_c20 = (byte)extraout_XMM0_Qb_01;
  bStack_c1f = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_c1e = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_c1d = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_c1c = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_c1b = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_c1a = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_c19 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_c38 = (byte)extraout_XMM0_Qa_10;
  bStack_c37 = (byte)((ulong)extraout_XMM0_Qa_10 >> 8);
  bStack_c36 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x10);
  bStack_c35 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x18);
  bStack_c34 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x20);
  bStack_c33 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x28);
  bStack_c32 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x30);
  bStack_c31 = (byte)((ulong)extraout_XMM0_Qa_10 >> 0x38);
  bStack_c30 = (byte)extraout_XMM0_Qb_02;
  bStack_c2f = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_c2e = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_c2d = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_c2c = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_c2b = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_c2a = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_c29 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  local_12b8 = (local_c28 < local_c38) * local_c38 | (local_c28 >= local_c38) * local_c28;
  bStack_12b7 = (bStack_c27 < bStack_c37) * bStack_c37 | (bStack_c27 >= bStack_c37) * bStack_c27;
  bStack_12b6 = (bStack_c26 < bStack_c36) * bStack_c36 | (bStack_c26 >= bStack_c36) * bStack_c26;
  bStack_12b5 = (bStack_c25 < bStack_c35) * bStack_c35 | (bStack_c25 >= bStack_c35) * bStack_c25;
  bStack_12b4 = (bStack_c24 < bStack_c34) * bStack_c34 | (bStack_c24 >= bStack_c34) * bStack_c24;
  bStack_12b3 = (bStack_c23 < bStack_c33) * bStack_c33 | (bStack_c23 >= bStack_c33) * bStack_c23;
  bStack_12b2 = (bStack_c22 < bStack_c32) * bStack_c32 | (bStack_c22 >= bStack_c32) * bStack_c22;
  bStack_12b1 = (bStack_c21 < bStack_c31) * bStack_c31 | (bStack_c21 >= bStack_c31) * bStack_c21;
  bStack_12b0 = (bStack_c20 < bStack_c30) * bStack_c30 | (bStack_c20 >= bStack_c30) * bStack_c20;
  bStack_12af = (bStack_c1f < bStack_c2f) * bStack_c2f | (bStack_c1f >= bStack_c2f) * bStack_c1f;
  bStack_12ae = (bStack_c1e < bStack_c2e) * bStack_c2e | (bStack_c1e >= bStack_c2e) * bStack_c1e;
  bStack_12ad = (bStack_c1d < bStack_c2d) * bStack_c2d | (bStack_c1d >= bStack_c2d) * bStack_c1d;
  bStack_12ac = (bStack_c1c < bStack_c2c) * bStack_c2c | (bStack_c1c >= bStack_c2c) * bStack_c1c;
  bStack_12ab = (bStack_c1b < bStack_c2b) * bStack_c2b | (bStack_c1b >= bStack_c2b) * bStack_c1b;
  bStack_12aa = (bStack_c1a < bStack_c2a) * bStack_c2a | (bStack_c1a >= bStack_c2a) * bStack_c1a;
  bStack_12a9 = (bStack_c19 < bStack_c29) * bStack_c29 | (bStack_c19 >= bStack_c29) * bStack_c19;
  local_c48 = CONCAT17(bStack_12b1,
                       CONCAT16(bStack_12b2,
                                CONCAT15(bStack_12b3,
                                         CONCAT14(bStack_12b4,
                                                  CONCAT13(bStack_12b5,
                                                           CONCAT12(bStack_12b6,
                                                                    CONCAT11(bStack_12b7,local_12b8)
                                                                   ))))));
  uStack_c40 = CONCAT17(bStack_12a9,
                        CONCAT16(bStack_12aa,
                                 CONCAT15(bStack_12ab,
                                          CONCAT14(bStack_12ac,
                                                   CONCAT13(bStack_12ad,
                                                            CONCAT12(bStack_12ae,
                                                                     CONCAT11(bStack_12af,
                                                                              bStack_12b0)))))));
  local_c58 = local_10c8._0_8_;
  uVar4 = local_c58;
  uStack_c50 = local_10c8._8_8_;
  uVar5 = uStack_c50;
  local_c58._0_1_ = local_10c8[0];
  local_c58._1_1_ = local_10c8[1];
  local_c58._2_1_ = local_10c8[2];
  local_c58._3_1_ = local_10c8[3];
  local_c58._4_1_ = local_10c8[4];
  local_c58._5_1_ = local_10c8[5];
  local_c58._6_1_ = local_10c8[6];
  local_c58._7_1_ = local_10c8[7];
  uStack_c50._0_1_ = local_10c8[8];
  uStack_c50._1_1_ = local_10c8[9];
  uStack_c50._2_1_ = local_10c8[10];
  uStack_c50._3_1_ = local_10c8[0xb];
  uStack_c50._4_1_ = local_10c8[0xc];
  uStack_c50._5_1_ = local_10c8[0xd];
  uStack_c50._6_1_ = local_10c8[0xe];
  uStack_c50._7_1_ = local_10c8[0xf];
  local_10c8[0] =
       (local_12b8 < (byte)local_c58) * (byte)local_c58 |
       (local_12b8 >= (byte)local_c58) * local_12b8;
  local_10c8[1] =
       (bStack_12b7 < local_c58._1_1_) * local_c58._1_1_ |
       (bStack_12b7 >= local_c58._1_1_) * bStack_12b7;
  local_10c8[2] =
       (bStack_12b6 < local_c58._2_1_) * local_c58._2_1_ |
       (bStack_12b6 >= local_c58._2_1_) * bStack_12b6;
  local_10c8[3] =
       (bStack_12b5 < local_c58._3_1_) * local_c58._3_1_ |
       (bStack_12b5 >= local_c58._3_1_) * bStack_12b5;
  local_10c8[4] =
       (bStack_12b4 < local_c58._4_1_) * local_c58._4_1_ |
       (bStack_12b4 >= local_c58._4_1_) * bStack_12b4;
  local_10c8[5] =
       (bStack_12b3 < local_c58._5_1_) * local_c58._5_1_ |
       (bStack_12b3 >= local_c58._5_1_) * bStack_12b3;
  local_10c8[6] =
       (bStack_12b2 < local_c58._6_1_) * local_c58._6_1_ |
       (bStack_12b2 >= local_c58._6_1_) * bStack_12b2;
  local_10c8[7] =
       (bStack_12b1 < local_c58._7_1_) * local_c58._7_1_ |
       (bStack_12b1 >= local_c58._7_1_) * bStack_12b1;
  local_10c8[8] =
       (bStack_12b0 < (byte)uStack_c50) * (byte)uStack_c50 |
       (bStack_12b0 >= (byte)uStack_c50) * bStack_12b0;
  local_10c8[9] =
       (bStack_12af < uStack_c50._1_1_) * uStack_c50._1_1_ |
       (bStack_12af >= uStack_c50._1_1_) * bStack_12af;
  local_10c8[10] =
       (bStack_12ae < uStack_c50._2_1_) * uStack_c50._2_1_ |
       (bStack_12ae >= uStack_c50._2_1_) * bStack_12ae;
  local_10c8[0xb] =
       (bStack_12ad < uStack_c50._3_1_) * uStack_c50._3_1_ |
       (bStack_12ad >= uStack_c50._3_1_) * bStack_12ad;
  local_10c8[0xc] =
       (bStack_12ac < uStack_c50._4_1_) * uStack_c50._4_1_ |
       (bStack_12ac >= uStack_c50._4_1_) * bStack_12ac;
  local_10c8[0xd] =
       (bStack_12ab < uStack_c50._5_1_) * uStack_c50._5_1_ |
       (bStack_12ab >= uStack_c50._5_1_) * bStack_12ab;
  local_10c8[0xe] =
       (bStack_12aa < uStack_c50._6_1_) * uStack_c50._6_1_ |
       (bStack_12aa >= uStack_c50._6_1_) * bStack_12aa;
  local_10c8[0xf] =
       (bStack_12a9 < uStack_c50._7_1_) * uStack_c50._7_1_ |
       (bStack_12a9 >= uStack_c50._7_1_) * bStack_12a9;
  local_c78 = local_10c8 >> 0x20;
  local_c68 = local_10c8;
  local_10c8[1] =
       (local_10c8[1] < local_10c8[5]) * local_10c8[5] |
       (local_10c8[1] >= local_10c8[5]) * local_10c8[1];
  local_10c8[0] =
       (local_10c8[0] < local_10c8[4]) * local_10c8[4] |
       (local_10c8[0] >= local_10c8[4]) * local_10c8[0];
  local_10c8[2] =
       (local_10c8[2] < local_10c8[6]) * local_10c8[6] |
       (local_10c8[2] >= local_10c8[6]) * local_10c8[2];
  local_10c8[3] =
       (local_10c8[3] < local_10c8[7]) * local_10c8[7] |
       (local_10c8[3] >= local_10c8[7]) * local_10c8[3];
  local_10c8[4] =
       (local_10c8[4] < local_10c8[8]) * local_10c8[8] |
       (local_10c8[4] >= local_10c8[8]) * local_10c8[4];
  local_10c8[5] =
       (local_10c8[5] < local_10c8[9]) * local_10c8[9] |
       (local_10c8[5] >= local_10c8[9]) * local_10c8[5];
  local_10c8[6] =
       (local_10c8[6] < local_10c8[10]) * local_10c8[10] |
       (local_10c8[6] >= local_10c8[10]) * local_10c8[6];
  local_10c8[7] =
       (local_10c8[7] < local_10c8[0xb]) * local_10c8[0xb] |
       (local_10c8[7] >= local_10c8[0xb]) * local_10c8[7];
  local_10c8[8] =
       (local_10c8[8] < local_10c8[0xc]) * local_10c8[0xc] |
       (local_10c8[8] >= local_10c8[0xc]) * local_10c8[8];
  local_10c8[9] =
       (local_10c8[9] < local_10c8[0xd]) * local_10c8[0xd] |
       (local_10c8[9] >= local_10c8[0xd]) * local_10c8[9];
  local_10c8[10] =
       (local_10c8[10] < local_10c8[0xe]) * local_10c8[0xe] |
       (local_10c8[10] >= local_10c8[0xe]) * local_10c8[10];
  local_10c8[0xb] =
       (local_10c8[0xb] < local_10c8[0xf]) * local_10c8[0xf] |
       (local_10c8[0xb] >= local_10c8[0xf]) * local_10c8[0xb];
  local_a58 = *(undefined8 *)*local_1098;
  uStack_a50 = *(undefined8 *)(*local_1098 + 8);
  local_a48 = local_10c8._0_8_;
  uStack_a40 = local_10c8._8_8_;
  auVar70._8_8_ = local_10c8._8_8_;
  auVar70._0_8_ = local_10c8._0_8_;
  auVar94 = psubusb(auVar70,*local_1098);
  local_10c8._0_8_ = auVar94._0_8_;
  local_10c8._8_8_ = auVar94._8_8_;
  local_d48 = local_10c8._0_8_;
  uVar2 = local_d48;
  uStack_d40 = local_10c8._8_8_;
  uVar3 = uStack_d40;
  local_d58 = local_10b8;
  uVar86 = local_d58;
  uStack_d50 = uStack_10b0;
  uVar1 = uStack_d50;
  local_d48._0_1_ = auVar94[0];
  local_d48._1_1_ = auVar94[1];
  local_d48._2_1_ = auVar94[2];
  local_d48._3_1_ = auVar94[3];
  local_d48._4_1_ = auVar94[4];
  local_d48._5_1_ = auVar94[5];
  local_d48._6_1_ = auVar94[6];
  local_d48._7_1_ = auVar94[7];
  uStack_d40._0_1_ = auVar94[8];
  uStack_d40._1_1_ = auVar94[9];
  uStack_d40._2_1_ = auVar94[10];
  uStack_d40._3_1_ = auVar94[0xb];
  uStack_d40._4_1_ = auVar94[0xc];
  uStack_d40._5_1_ = auVar94[0xd];
  uStack_d40._6_1_ = auVar94[0xe];
  uStack_d40._7_1_ = auVar94[0xf];
  local_d58._0_1_ = (char)local_10b8;
  local_d58._1_1_ = (char)((ulong)local_10b8 >> 8);
  local_d58._2_1_ = (char)((ulong)local_10b8 >> 0x10);
  local_d58._3_1_ = (char)((ulong)local_10b8 >> 0x18);
  local_d58._4_1_ = (char)((ulong)local_10b8 >> 0x20);
  local_d58._5_1_ = (char)((ulong)local_10b8 >> 0x28);
  local_d58._6_1_ = (char)((ulong)local_10b8 >> 0x30);
  local_d58._7_1_ = (char)((ulong)local_10b8 >> 0x38);
  uStack_d50._0_1_ = (char)uStack_10b0;
  uStack_d50._1_1_ = (char)((ulong)uStack_10b0 >> 8);
  uStack_d50._2_1_ = (char)((ulong)uStack_10b0 >> 0x10);
  uStack_d50._3_1_ = (char)((ulong)uStack_10b0 >> 0x18);
  uStack_d50._4_1_ = (char)((ulong)uStack_10b0 >> 0x20);
  uStack_d50._5_1_ = (char)((ulong)uStack_10b0 >> 0x28);
  uStack_d50._6_1_ = (char)((ulong)uStack_10b0 >> 0x30);
  uStack_d50._7_1_ = (char)((ulong)uStack_10b0 >> 0x38);
  local_10c8[1] = -(local_d48._1_1_ == local_d58._1_1_);
  local_10c8[0] = -((char)local_d48 == (char)local_d58);
  local_10c8[2] = -(local_d48._2_1_ == local_d58._2_1_);
  local_10c8[3] = -(local_d48._3_1_ == local_d58._3_1_);
  local_10c8[4] = -(local_d48._4_1_ == local_d58._4_1_);
  local_10c8[5] = -(local_d48._5_1_ == local_d58._5_1_);
  local_10c8[6] = -(local_d48._6_1_ == local_d58._6_1_);
  local_10c8[7] = -(local_d48._7_1_ == local_d58._7_1_);
  local_10c8[8] = -((char)uStack_d40 == (char)uStack_d50);
  local_10c8[9] = -(uStack_d40._1_1_ == uStack_d50._1_1_);
  local_10c8[10] = -(uStack_d40._2_1_ == uStack_d50._2_1_);
  local_10c8[0xb] = -(uStack_d40._3_1_ == uStack_d50._3_1_);
  local_10c8[0xc] = -(uStack_d40._4_1_ == uStack_d50._4_1_);
  local_10c8[0xd] = -(uStack_d40._5_1_ == uStack_d50._5_1_);
  local_10c8[0xe] = -(uStack_d40._6_1_ == uStack_d50._6_1_);
  local_10c8[0xf] = -(uStack_d40._7_1_ == uStack_d50._7_1_);
  local_440 = &local_11e8;
  local_448 = &local_11d8;
  local_450 = &local_10d8;
  local_460 = local_1080;
  local_468 = local_1088;
  local_109 = 0;
  local_10a = 0;
  local_10b = 0;
  local_10c = 0;
  local_10d = 0;
  local_10e = 0;
  local_10f = 0;
  local_110 = 0;
  local_111 = 3;
  local_112 = 3;
  local_113 = 3;
  local_114 = 3;
  local_115 = 4;
  local_116 = 4;
  local_117 = 4;
  local_118 = 4;
  local_4d8 = 0x303030304040404;
  uStack_4d0 = 0;
  local_389 = 0x80;
  local_129 = 0x80;
  local_12a = 0x80;
  local_12b = 0x80;
  local_12c = 0x80;
  local_12d = 0x80;
  local_12e = 0x80;
  local_12f = 0x80;
  local_130 = 0x80;
  local_131 = 0x80;
  local_132 = 0x80;
  local_133 = 0x80;
  local_134 = 0x80;
  local_135 = 0x80;
  local_136 = 0x80;
  local_137 = 0x80;
  local_138 = 0x80;
  local_4e8 = 0x8080808080808080;
  uStack_4e0 = 0x8080808080808080;
  local_4f8 = 0xff;
  uStack_4f7 = 0xff;
  uStack_4f6 = 0xff;
  uStack_4f5 = 0xff;
  uStack_4f4 = 0xff;
  uStack_4f3 = 0xff;
  uStack_4f2 = 0xff;
  uStack_4f1 = 0xff;
  uStack_4f0 = 0xff;
  uStack_4ef = 0xff;
  uStack_4ee = 0xff;
  uStack_4ed = 0xff;
  uStack_4ec = 0xff;
  uStack_4eb = 0xff;
  uStack_4ea = 0xff;
  uStack_4e9 = 0xff;
  local_2b8 = local_11e8;
  uStack_2b0 = uStack_11e0;
  local_1f8 = local_11e8 ^ 0x8080808080808080;
  uStack_1f0 = uStack_11e0 ^ 0x8080808080808080;
  local_2d8 = local_11d8;
  uStack_2d0 = uStack_11d0;
  local_298 = local_11d8 ^ 0x8080808080808080;
  uStack_290 = uStack_11d0 ^ 0x8080808080808080;
  auVar78._8_8_ = uStack_1f0;
  auVar78._0_8_ = local_1f8;
  auVar77._8_8_ = uStack_290;
  auVar77._0_8_ = local_298;
  local_498 = psubsb(auVar78,auVar77);
  local_348 = local_10d8;
  uStack_340 = uStack_10d0;
  local_338._0_8_ = local_498._4_8_;
  local_338._12_4_ = 0;
  local_338._8_4_ = local_498._12_4_;
  local_218 = local_338._0_8_ & local_10d8;
  uStack_210 = local_338._8_8_ & uStack_10d0;
  local_228 = local_498._0_8_;
  uStack_220 = local_498._8_8_;
  auVar76._8_8_ = uStack_210;
  auVar76._0_8_ = local_218;
  auVar94 = psubsb(auVar76,local_498);
  local_478 = auVar94._0_8_;
  uStack_470 = auVar94._8_8_;
  local_238 = local_478;
  uStack_230 = uStack_470;
  local_248 = local_498._0_8_;
  uStack_240 = local_498._8_8_;
  auVar94 = psubsb(auVar94,local_498);
  local_478 = auVar94._0_8_;
  uStack_470 = auVar94._8_8_;
  local_258 = local_478;
  uStack_250 = uStack_470;
  local_268 = local_498._0_8_;
  uStack_260 = local_498._8_8_;
  auVar94 = psubsb(auVar94,local_498);
  local_478 = auVar94._0_8_;
  uStack_470 = auVar94._8_8_;
  local_368 = local_10c8._0_8_;
  uStack_360 = local_10c8._8_8_;
  local_358 = local_478;
  uStack_350 = uStack_470;
  local_3f8 = local_478 & local_10c8._0_8_;
  uStack_3f0 = uStack_470 & local_10c8._8_8_;
  local_3e8._0_4_ = (undefined4)local_3f8;
  local_3e8._4_4_ = (undefined4)(local_3f8 >> 0x20);
  local_478 = CONCAT44((undefined4)local_3e8,(undefined4)local_3e8);
  uStack_470._0_4_ = local_3e8._4_4_;
  uStack_470._4_4_ = local_3e8._4_4_;
  local_1b8 = local_478;
  uStack_1b0 = uStack_470;
  auVar81._8_8_ = uStack_470;
  auVar81._0_8_ = local_478;
  auVar94 = paddsb(auVar81,ZEXT816(0x303030304040404));
  local_488 = auVar94._0_8_;
  uStack_480 = auVar94._8_8_;
  local_3a8 = local_488;
  uVar8 = local_3a8;
  uStack_3a0 = uStack_480;
  local_3b8 = local_488;
  uStack_3b0 = uStack_480;
  local_3a8._0_1_ = auVar94[0];
  local_3a8._1_1_ = auVar94[1];
  local_3a8._2_1_ = auVar94[2];
  local_3a8._3_1_ = auVar94[3];
  local_3a8._4_1_ = auVar94[4];
  local_3a8._5_1_ = auVar94[5];
  local_3a8._6_1_ = auVar94[6];
  local_3a8._7_1_ = auVar94[7];
  local_488._0_2_ = CONCAT11((undefined1)local_3a8,(undefined1)local_3a8);
  local_488._0_3_ = CONCAT12(local_3a8._1_1_,(undefined2)local_488);
  local_488._0_4_ = CONCAT13(local_3a8._1_1_,(undefined3)local_488);
  local_488._0_5_ = CONCAT14(local_3a8._2_1_,(undefined4)local_488);
  local_488._0_6_ = CONCAT15(local_3a8._2_1_,(undefined5)local_488);
  local_488._0_7_ = CONCAT16(local_3a8._3_1_,(undefined6)local_488);
  local_488 = CONCAT17(local_3a8._3_1_,(undefined7)local_488);
  uStack_480._0_1_ = local_3a8._4_1_;
  uStack_480._1_1_ = local_3a8._4_1_;
  uStack_480._2_1_ = local_3a8._5_1_;
  uStack_480._3_1_ = local_3a8._5_1_;
  uStack_480._4_1_ = local_3a8._6_1_;
  uStack_480._5_1_ = local_3a8._6_1_;
  uStack_480._6_1_ = local_3a8._7_1_;
  uStack_480._7_1_ = local_3a8._7_1_;
  local_98 = local_488;
  uStack_90 = uStack_480;
  local_9c = 0xb;
  auVar83._8_8_ = uStack_480;
  auVar83._0_8_ = local_488;
  auVar94 = psraw(auVar83,ZEXT416(0xb));
  local_488 = auVar94._0_8_;
  uStack_480 = auVar94._8_8_;
  local_158 = local_488;
  uStack_150 = uStack_480;
  local_168 = local_488;
  uStack_160 = uStack_480;
  auVar94 = packsswb(auVar94,auVar94);
  local_488 = auVar94._0_8_;
  uStack_480 = auVar94._8_8_;
  local_288 = 0xffffffffffffffff;
  uStack_280 = 0xffffffffffffffff;
  local_278 = local_488;
  uStack_270 = uStack_480;
  auVar75._8_8_ = 0xffffffffffffffff;
  auVar75._0_8_ = 0xffffffffffffffff;
  auVar96 = psubsb(auVar94,auVar75);
  local_478 = auVar96._0_8_;
  uStack_470 = auVar96._8_8_;
  local_3c8 = local_478;
  uVar7 = local_3c8;
  uStack_3c0 = uStack_470;
  local_3d8 = local_478;
  uStack_3d0 = uStack_470;
  local_3c8._0_1_ = auVar96[0];
  local_3c8._1_1_ = auVar96[1];
  local_3c8._2_1_ = auVar96[2];
  local_3c8._3_1_ = auVar96[3];
  local_3c8._4_1_ = auVar96[4];
  local_3c8._5_1_ = auVar96[5];
  local_3c8._6_1_ = auVar96[6];
  local_3c8._7_1_ = auVar96[7];
  local_478._0_2_ = CONCAT11((undefined1)local_3c8,(undefined1)local_3c8);
  local_478._0_3_ = CONCAT12(local_3c8._1_1_,(undefined2)local_478);
  local_478._0_4_ = CONCAT13(local_3c8._1_1_,(undefined3)local_478);
  local_478._0_5_ = CONCAT14(local_3c8._2_1_,(undefined4)local_478);
  local_478._0_6_ = CONCAT15(local_3c8._2_1_,(undefined5)local_478);
  local_478._0_7_ = CONCAT16(local_3c8._3_1_,(undefined6)local_478);
  local_478 = CONCAT17(local_3c8._3_1_,(undefined7)local_478);
  uStack_470._0_1_ = local_3c8._4_1_;
  uStack_470._1_1_ = local_3c8._4_1_;
  uStack_470._2_1_ = local_3c8._5_1_;
  uStack_470._3_1_ = local_3c8._5_1_;
  uStack_470._4_1_ = local_3c8._6_1_;
  uStack_470._5_1_ = local_3c8._6_1_;
  uStack_470._6_1_ = local_3c8._7_1_;
  uStack_470._7_1_ = local_3c8._7_1_;
  local_b8 = local_478;
  uStack_b0 = uStack_470;
  local_bc = 9;
  auVar82._8_8_ = uStack_470;
  auVar82._0_8_ = local_478;
  auVar96 = psraw(auVar82,ZEXT416(9));
  local_478 = auVar96._0_8_;
  uStack_470 = auVar96._8_8_;
  local_178 = local_478;
  uStack_170 = uStack_470;
  local_188 = local_478;
  uStack_180 = uStack_470;
  auVar96 = packsswb(auVar96,auVar96);
  local_198 = local_10d8;
  uStack_190 = uStack_10d0;
  local_478 = auVar96._0_8_;
  uStack_470 = auVar96._8_8_;
  local_1a8 = local_478;
  uStack_1a0 = uStack_470;
  local_418 = ~local_10d8 & local_478;
  uStack_410 = ~uStack_10d0 & uStack_470;
  local_408._0_4_ = (undefined4)local_418;
  local_408._4_4_ = (undefined4)(local_418 >> 0x20);
  local_478 = CONCAT44((undefined4)local_408,(undefined4)local_408);
  uStack_470._0_4_ = local_408._4_4_;
  uStack_470._4_4_ = local_408._4_4_;
  local_428 = local_488;
  uVar6 = local_428;
  uStack_420 = uStack_480;
  local_438 = local_478;
  uStack_430 = uStack_470;
  local_428._0_4_ = auVar94._0_4_;
  local_428._4_4_ = auVar94._4_4_;
  local_488 = CONCAT44((undefined4)local_408,(undefined4)local_428);
  uStack_480._0_4_ = local_428._4_4_;
  uStack_480._4_4_ = (undefined4)local_408;
  local_4c8 = uStack_480;
  uStack_4c0 = 0;
  local_2a8 = local_488;
  uStack_2a0 = uStack_480;
  auVar74._8_8_ = uStack_290;
  auVar74._0_8_ = local_298;
  auVar73._8_8_ = uStack_480;
  auVar73._0_8_ = local_488;
  local_4b8 = psubsb(auVar74,auVar73);
  local_1e8 = uStack_480;
  uStack_1e0 = 0;
  auVar80._8_8_ = uStack_1f0;
  auVar80._0_8_ = local_1f8;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uStack_480;
  local_4a8 = paddsb(auVar80,auVar79);
  local_2f8 = local_4b8._0_8_;
  uStack_2f0 = local_4b8._8_8_;
  uVar87 = local_4b8._8_8_ ^ 0x8080808080808080;
  local_d58 = uVar86;
  uStack_d50 = uVar1;
  local_d48 = uVar2;
  uStack_d40 = uVar3;
  local_c58 = uVar4;
  uStack_c50 = uVar5;
  local_458 = local_10c8;
  local_428 = uVar6;
  local_408 = local_418;
  uStack_400 = uStack_410;
  local_3e8 = local_3f8;
  uStack_3e0 = uStack_3f0;
  local_3c8 = uVar7;
  local_3a8 = uVar8;
  local_388 = local_4e8;
  uStack_380 = uStack_4e0;
  local_378 = local_4e8;
  uStack_370 = uStack_4e0;
  local_338 = local_498 >> 0x20;
  local_308 = local_4e8;
  uStack_300 = uStack_4e0;
  local_2e8 = local_4e8;
  uStack_2e0 = uStack_4e0;
  local_2c8 = local_4e8;
  uStack_2c0 = uStack_4e0;
  local_208 = local_298;
  uStack_200 = uStack_290;
  local_1d8 = local_1f8;
  uStack_1d0 = uStack_1f0;
  local_1c8 = local_4d8;
  uStack_1c0 = uStack_4d0;
  local_148 = local_4e8;
  uStack_140 = uStack_4e0;
  local_128 = local_4d8;
  uStack_120 = uStack_4d0;
  *local_1080 = local_4b8._0_8_ ^ 0x8080808080808080;
  puVar88[1] = uVar87;
  puVar85 = local_468;
  local_318 = local_4a8._0_8_;
  uStack_310 = local_4a8._8_8_;
  local_328 = local_4e8;
  uStack_320 = uStack_4e0;
  uVar87 = local_4a8._8_8_ ^ uStack_4e0;
  *local_468 = local_4a8._0_8_ ^ local_4e8;
  puVar85[1] = uVar87;
  b_02[1] = (longlong)puVar88;
  b_02[0] = (longlong)local_10c8;
  a_04[1] = in_RSI;
  a_04[0] = (longlong)a;
  alVar114 = abs_diff(a_04,b_02);
  b_03[0] = alVar114[1];
  b_03[1] = (longlong)puVar88;
  a_05[1] = in_RSI;
  a_05[0] = (longlong)a;
  alVar114 = abs_diff(a_05,b_03);
  pauVar84 = local_1050;
  v[1] = alVar114[1];
  local_c88 = (byte)extraout_XMM0_Qa_11;
  bStack_c87 = (byte)((ulong)extraout_XMM0_Qa_11 >> 8);
  bStack_c86 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x10);
  bStack_c85 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x18);
  bStack_c84 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x20);
  bStack_c83 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x28);
  bStack_c82 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x30);
  bStack_c81 = (byte)((ulong)extraout_XMM0_Qa_11 >> 0x38);
  bStack_c80 = (byte)extraout_XMM0_Qb_03;
  bStack_c7f = (byte)((ulong)extraout_XMM0_Qb_03 >> 8);
  bStack_c7e = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x10);
  bStack_c7d = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x18);
  bStack_c7c = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x20);
  bStack_c7b = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x28);
  bStack_c7a = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x30);
  bStack_c79 = (byte)((ulong)extraout_XMM0_Qb_03 >> 0x38);
  local_c98 = (byte)extraout_XMM0_Qa_12;
  bStack_c97 = (byte)((ulong)extraout_XMM0_Qa_12 >> 8);
  bStack_c96 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x10);
  bStack_c95 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x18);
  bStack_c94 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x20);
  bStack_c93 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x28);
  bStack_c92 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x30);
  bStack_c91 = (byte)((ulong)extraout_XMM0_Qa_12 >> 0x38);
  bStack_c90 = (byte)extraout_XMM0_Qb_04;
  bStack_c8f = (byte)((ulong)extraout_XMM0_Qb_04 >> 8);
  bStack_c8e = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x10);
  bStack_c8d = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x18);
  bStack_c8c = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x20);
  bStack_c8b = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x28);
  bStack_c8a = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x30);
  bStack_c89 = (byte)((ulong)extraout_XMM0_Qb_04 >> 0x38);
  local_10e8[0] = (local_c88 < local_c98) * local_c98 | (local_c88 >= local_c98) * local_c88;
  local_10e8[1] = (bStack_c87 < bStack_c97) * bStack_c97 | (bStack_c87 >= bStack_c97) * bStack_c87;
  local_10e8[2] = (bStack_c86 < bStack_c96) * bStack_c96 | (bStack_c86 >= bStack_c96) * bStack_c86;
  local_10e8[3] = (bStack_c85 < bStack_c95) * bStack_c95 | (bStack_c85 >= bStack_c95) * bStack_c85;
  local_10e8[4] = (bStack_c84 < bStack_c94) * bStack_c94 | (bStack_c84 >= bStack_c94) * bStack_c84;
  local_10e8[5] = (bStack_c83 < bStack_c93) * bStack_c93 | (bStack_c83 >= bStack_c93) * bStack_c83;
  local_10e8[6] = (bStack_c82 < bStack_c92) * bStack_c92 | (bStack_c82 >= bStack_c92) * bStack_c82;
  local_10e8[7] = (bStack_c81 < bStack_c91) * bStack_c91 | (bStack_c81 >= bStack_c91) * bStack_c81;
  bVar100 = (bStack_c80 < bStack_c90) * bStack_c90 | (bStack_c80 >= bStack_c90) * bStack_c80;
  bVar104 = (bStack_c7f < bStack_c8f) * bStack_c8f | (bStack_c7f >= bStack_c8f) * bStack_c7f;
  bVar105 = (bStack_c7e < bStack_c8e) * bStack_c8e | (bStack_c7e >= bStack_c8e) * bStack_c7e;
  bVar107 = (bStack_c7d < bStack_c8d) * bStack_c8d | (bStack_c7d >= bStack_c8d) * bStack_c7d;
  bVar108 = (bStack_c7c < bStack_c8c) * bStack_c8c | (bStack_c7c >= bStack_c8c) * bStack_c7c;
  bVar110 = (bStack_c7b < bStack_c8b) * bStack_c8b | (bStack_c7b >= bStack_c8b) * bStack_c7b;
  bVar111 = (bStack_c7a < bStack_c8a) * bStack_c8a | (bStack_c7a >= bStack_c8a) * bStack_c7a;
  bVar113 = (bStack_c79 < bStack_c89) * bStack_c89 | (bStack_c79 >= bStack_c89) * bStack_c79;
  local_10e8[8] = bVar100;
  local_10e8[9] = bVar104;
  local_10e8[10] = bVar105;
  local_10e8[0xb] = bVar107;
  local_10e8[0xc] = bVar108;
  local_10e8[0xd] = bVar110;
  local_10e8[0xe] = bVar111;
  local_10e8[0xf] = bVar113;
  local_ca8 = local_12a8;
  uVar4 = local_ca8;
  uStack_ca0 = uStack_12a0;
  uVar5 = uStack_ca0;
  local_cb8 = local_10e8._0_8_;
  uStack_cb0 = local_10e8._8_8_;
  local_ca8._0_1_ = (byte)local_12a8;
  local_ca8._1_1_ = (byte)((ulong)local_12a8 >> 8);
  local_ca8._2_1_ = (byte)((ulong)local_12a8 >> 0x10);
  local_ca8._3_1_ = (byte)((ulong)local_12a8 >> 0x18);
  local_ca8._4_1_ = (byte)((ulong)local_12a8 >> 0x20);
  local_ca8._5_1_ = (byte)((ulong)local_12a8 >> 0x28);
  local_ca8._6_1_ = (byte)((ulong)local_12a8 >> 0x30);
  local_ca8._7_1_ = (byte)((ulong)local_12a8 >> 0x38);
  uStack_ca0._0_1_ = (byte)uStack_12a0;
  uStack_ca0._1_1_ = (byte)((ulong)uStack_12a0 >> 8);
  uStack_ca0._2_1_ = (byte)((ulong)uStack_12a0 >> 0x10);
  uStack_ca0._3_1_ = (byte)((ulong)uStack_12a0 >> 0x18);
  uStack_ca0._4_1_ = (byte)((ulong)uStack_12a0 >> 0x20);
  uStack_ca0._5_1_ = (byte)((ulong)uStack_12a0 >> 0x28);
  uStack_ca0._6_1_ = (byte)((ulong)uStack_12a0 >> 0x30);
  uStack_ca0._7_1_ = (byte)((ulong)uStack_12a0 >> 0x38);
  local_10e8[0] =
       ((byte)local_ca8 < local_10e8[0]) * local_10e8[0] |
       ((byte)local_ca8 >= local_10e8[0]) * (byte)local_ca8;
  local_10e8[1] =
       (local_ca8._1_1_ < local_10e8[1]) * local_10e8[1] |
       (local_ca8._1_1_ >= local_10e8[1]) * local_ca8._1_1_;
  local_10e8[2] =
       (local_ca8._2_1_ < local_10e8[2]) * local_10e8[2] |
       (local_ca8._2_1_ >= local_10e8[2]) * local_ca8._2_1_;
  local_10e8[3] =
       (local_ca8._3_1_ < local_10e8[3]) * local_10e8[3] |
       (local_ca8._3_1_ >= local_10e8[3]) * local_ca8._3_1_;
  local_10e8[4] =
       (local_ca8._4_1_ < local_10e8[4]) * local_10e8[4] |
       (local_ca8._4_1_ >= local_10e8[4]) * local_ca8._4_1_;
  local_10e8[5] =
       (local_ca8._5_1_ < local_10e8[5]) * local_10e8[5] |
       (local_ca8._5_1_ >= local_10e8[5]) * local_ca8._5_1_;
  local_10e8[6] =
       (local_ca8._6_1_ < local_10e8[6]) * local_10e8[6] |
       (local_ca8._6_1_ >= local_10e8[6]) * local_ca8._6_1_;
  local_10e8[7] =
       (local_ca8._7_1_ < local_10e8[7]) * local_10e8[7] |
       (local_ca8._7_1_ >= local_10e8[7]) * local_ca8._7_1_;
  local_10e8[8] =
       ((byte)uStack_ca0 < bVar100) * bVar100 | ((byte)uStack_ca0 >= bVar100) * (byte)uStack_ca0;
  local_10e8[9] =
       (uStack_ca0._1_1_ < bVar104) * bVar104 | (uStack_ca0._1_1_ >= bVar104) * uStack_ca0._1_1_;
  local_10e8[10] =
       (uStack_ca0._2_1_ < bVar105) * bVar105 | (uStack_ca0._2_1_ >= bVar105) * uStack_ca0._2_1_;
  local_10e8[0xb] =
       (uStack_ca0._3_1_ < bVar107) * bVar107 | (uStack_ca0._3_1_ >= bVar107) * uStack_ca0._3_1_;
  local_10e8[0xc] =
       (uStack_ca0._4_1_ < bVar108) * bVar108 | (uStack_ca0._4_1_ >= bVar108) * uStack_ca0._4_1_;
  local_10e8[0xd] =
       (uStack_ca0._5_1_ < bVar110) * bVar110 | (uStack_ca0._5_1_ >= bVar110) * uStack_ca0._5_1_;
  local_10e8[0xe] =
       (uStack_ca0._6_1_ < bVar111) * bVar111 | (uStack_ca0._6_1_ >= bVar111) * uStack_ca0._6_1_;
  local_10e8[0xf] =
       (uStack_ca0._7_1_ < bVar113) * bVar113 | (uStack_ca0._7_1_ >= bVar113) * uStack_ca0._7_1_;
  local_cd8 = local_10e8 >> 0x20;
  local_cc8 = local_10e8;
  local_10e8[1] =
       (local_10e8[1] < local_10e8[5]) * local_10e8[5] |
       (local_10e8[1] >= local_10e8[5]) * local_10e8[1];
  local_10e8[0] =
       (local_10e8[0] < local_10e8[4]) * local_10e8[4] |
       (local_10e8[0] >= local_10e8[4]) * local_10e8[0];
  local_10e8[2] =
       (local_10e8[2] < local_10e8[6]) * local_10e8[6] |
       (local_10e8[2] >= local_10e8[6]) * local_10e8[2];
  local_10e8[3] =
       (local_10e8[3] < local_10e8[7]) * local_10e8[7] |
       (local_10e8[3] >= local_10e8[7]) * local_10e8[3];
  local_10e8[4] =
       (local_10e8[4] < local_10e8[8]) * local_10e8[8] |
       (local_10e8[4] >= local_10e8[8]) * local_10e8[4];
  local_10e8[5] =
       (local_10e8[5] < local_10e8[9]) * local_10e8[9] |
       (local_10e8[5] >= local_10e8[9]) * local_10e8[5];
  local_10e8[6] =
       (local_10e8[6] < local_10e8[10]) * local_10e8[10] |
       (local_10e8[6] >= local_10e8[10]) * local_10e8[6];
  local_10e8[7] =
       (local_10e8[7] < local_10e8[0xb]) * local_10e8[0xb] |
       (local_10e8[7] >= local_10e8[0xb]) * local_10e8[7];
  local_10e8[8] =
       (local_10e8[8] < local_10e8[0xc]) * local_10e8[0xc] |
       (local_10e8[8] >= local_10e8[0xc]) * local_10e8[8];
  local_10e8[9] =
       (local_10e8[9] < local_10e8[0xd]) * local_10e8[0xd] |
       (local_10e8[9] >= local_10e8[0xd]) * local_10e8[9];
  local_10e8[10] =
       (local_10e8[10] < local_10e8[0xe]) * local_10e8[0xe] |
       (local_10e8[10] >= local_10e8[0xe]) * local_10e8[10];
  local_10e8[0xb] =
       (local_10e8[0xb] < local_10e8[0xf]) * local_10e8[0xf] |
       (local_10e8[0xb] >= local_10e8[0xf]) * local_10e8[0xb];
  local_a68 = local_10e8._0_8_;
  uStack_a60 = local_10e8._8_8_;
  local_a78 = local_1248;
  uStack_a70 = uStack_1240;
  auVar69._8_8_ = local_10e8._8_8_;
  auVar69._0_8_ = local_10e8._0_8_;
  auVar68._8_8_ = uStack_1240;
  auVar68._0_8_ = local_1248;
  auVar94 = psubusb(auVar69,auVar68);
  local_10e8._0_8_ = auVar94._0_8_;
  local_10e8._8_8_ = auVar94._8_8_;
  local_d68 = local_10e8._0_8_;
  uVar2 = local_d68;
  uStack_d60 = local_10e8._8_8_;
  uVar3 = uStack_d60;
  local_d78 = local_10b8;
  uVar86 = local_d78;
  uStack_d70 = uStack_10b0;
  uVar1 = uStack_d70;
  local_d68._0_1_ = auVar94[0];
  local_d68._1_1_ = auVar94[1];
  local_d68._2_1_ = auVar94[2];
  local_d68._3_1_ = auVar94[3];
  local_d68._4_1_ = auVar94[4];
  local_d68._5_1_ = auVar94[5];
  local_d68._6_1_ = auVar94[6];
  local_d68._7_1_ = auVar94[7];
  uStack_d60._0_1_ = auVar94[8];
  uStack_d60._1_1_ = auVar94[9];
  uStack_d60._2_1_ = auVar94[10];
  uStack_d60._3_1_ = auVar94[0xb];
  uStack_d60._4_1_ = auVar94[0xc];
  uStack_d60._5_1_ = auVar94[0xd];
  uStack_d60._6_1_ = auVar94[0xe];
  uStack_d60._7_1_ = auVar94[0xf];
  local_d78._0_1_ = (char)local_10b8;
  local_d78._1_1_ = (char)((ulong)local_10b8 >> 8);
  local_d78._2_1_ = (char)((ulong)local_10b8 >> 0x10);
  local_d78._3_1_ = (char)((ulong)local_10b8 >> 0x18);
  local_d78._4_1_ = (char)((ulong)local_10b8 >> 0x20);
  local_d78._5_1_ = (char)((ulong)local_10b8 >> 0x28);
  local_d78._6_1_ = (char)((ulong)local_10b8 >> 0x30);
  local_d78._7_1_ = (char)((ulong)local_10b8 >> 0x38);
  uStack_d70._0_1_ = (char)uStack_10b0;
  uStack_d70._1_1_ = (char)((ulong)uStack_10b0 >> 8);
  uStack_d70._2_1_ = (char)((ulong)uStack_10b0 >> 0x10);
  uStack_d70._3_1_ = (char)((ulong)uStack_10b0 >> 0x18);
  uStack_d70._4_1_ = (char)((ulong)uStack_10b0 >> 0x20);
  uStack_d70._5_1_ = (char)((ulong)uStack_10b0 >> 0x28);
  uStack_d70._6_1_ = (char)((ulong)uStack_10b0 >> 0x30);
  uStack_d70._7_1_ = (char)((ulong)uStack_10b0 >> 0x38);
  local_10e8[1] = -(local_d68._1_1_ == local_d78._1_1_);
  local_10e8[0] = -((char)local_d68 == (char)local_d78);
  local_10e8[2] = -(local_d68._2_1_ == local_d78._2_1_);
  local_10e8[3] = -(local_d68._3_1_ == local_d78._3_1_);
  local_10e8[4] = -(local_d68._4_1_ == local_d78._4_1_);
  local_10e8[5] = -(local_d68._5_1_ == local_d78._5_1_);
  local_10e8[6] = -(local_d68._6_1_ == local_d78._6_1_);
  local_10e8[7] = -(local_d68._7_1_ == local_d78._7_1_);
  local_10e8[8] = -((char)uStack_d60 == (char)uStack_d70);
  local_10e8[9] = -(uStack_d60._1_1_ == uStack_d70._1_1_);
  local_10e8[10] = -(uStack_d60._2_1_ == uStack_d70._2_1_);
  local_10e8[0xb] = -(uStack_d60._3_1_ == uStack_d70._3_1_);
  local_10e8[0xc] = -(uStack_d60._4_1_ == uStack_d70._4_1_);
  local_10e8[0xd] = -(uStack_d60._5_1_ == uStack_d70._5_1_);
  local_10e8[0xe] = -(uStack_d60._6_1_ == uStack_d70._6_1_);
  local_10e8[0xf] = -(uStack_d60._7_1_ == uStack_d70._7_1_);
  local_aa8 = local_10e8._0_8_;
  uStack_aa0 = local_10e8._8_8_;
  local_ab8 = local_10c8._0_8_;
  uStack_ab0 = local_10c8._8_8_;
  local_1028 = local_10e8._0_8_ & local_10c8._0_8_;
  uStack_1020 = local_10e8._8_8_ & local_10c8._8_8_;
  local_1018._0_4_ = (undefined4)local_1028;
  local_1018._4_4_ = (undefined4)(local_1028 >> 0x20);
  local_10e8._4_4_ = (undefined4)local_1018;
  local_10e8._0_4_ = (undefined4)local_1018;
  local_10e8._8_4_ = local_1018._4_4_;
  local_10e8._12_4_ = local_1018._4_4_;
  local_db8 = local_10e8._0_8_;
  uStack_db0 = local_10e8._8_8_;
  local_dc8 = local_10e8._0_8_;
  uStack_dc0 = local_10e8._8_8_;
  local_10e8._8_8_ = local_10e8._0_8_;
  local_d88 = local_10e8._0_8_;
  uVar87 = local_d88;
  uStack_d80 = local_10e8._0_8_;
  local_d98 = local_10b8;
  uStack_d90 = uStack_10b0;
  local_d88._0_1_ = (char)local_1028;
  local_d88._1_1_ = (char)(local_1028 >> 8);
  local_d88._2_1_ = (char)(local_1028 >> 0x10);
  local_d88._3_1_ = (char)(local_1028 >> 0x18);
  local_9b8 = -((char)local_d88 == (char)local_d78);
  cStack_9b7 = -(local_d88._1_1_ == local_d78._1_1_);
  cStack_9b6 = -(local_d88._2_1_ == local_d78._2_1_);
  cStack_9b5 = -(local_d88._3_1_ == local_d78._3_1_);
  cStack_9b4 = -((char)local_d88 == local_d78._4_1_);
  cStack_9b3 = -(local_d88._1_1_ == local_d78._5_1_);
  cStack_9b2 = -(local_d88._2_1_ == local_d78._6_1_);
  cStack_9b1 = -(local_d88._3_1_ == local_d78._7_1_);
  cStack_9b0 = -((char)local_d88 == (char)uStack_d70);
  cStack_9af = -(local_d88._1_1_ == uStack_d70._1_1_);
  cStack_9ae = -(local_d88._2_1_ == uStack_d70._2_1_);
  cStack_9ad = -(local_d88._3_1_ == uStack_d70._3_1_);
  cStack_9ac = -((char)local_d88 == uStack_d70._4_1_);
  cStack_9ab = -(local_d88._1_1_ == uStack_d70._5_1_);
  cStack_9aa = -(local_d88._2_1_ == uStack_d70._6_1_);
  bStack_9a9 = -(local_d88._3_1_ == uStack_d70._7_1_);
  auVar72[1] = cStack_9b7;
  auVar72[0] = local_9b8;
  auVar72[2] = cStack_9b6;
  auVar72[3] = cStack_9b5;
  auVar72[4] = cStack_9b4;
  auVar72[5] = cStack_9b3;
  auVar72[6] = cStack_9b2;
  auVar72[7] = cStack_9b1;
  auVar72[8] = cStack_9b0;
  auVar72[9] = cStack_9af;
  auVar72[10] = cStack_9ae;
  auVar72[0xb] = cStack_9ad;
  auVar72[0xc] = cStack_9ac;
  auVar72[0xd] = cStack_9ab;
  auVar72[0xe] = cStack_9aa;
  auVar72[0xf] = bStack_9a9;
  local_1018 = local_1028;
  uStack_1010 = uStack_1020;
  local_d88 = uVar87;
  uStack_d70 = uVar1;
  local_d68 = uVar2;
  uStack_d60 = uVar3;
  local_ca8 = uVar4;
  uStack_ca0 = uVar5;
  if ((ushort)((ushort)(SUB161(auVar72 >> 7,0) & 1) | (ushort)(SUB161(auVar72 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar72 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar72 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar72 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar72 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar72 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar72 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar72 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar72 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar72 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar72 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar72 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar72 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar72 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_9a9 >> 7) << 0xf) !=
      0xffff) {
    local_8da = 4;
    local_2 = 4;
    local_4 = 4;
    local_6 = 4;
    local_8 = 4;
    local_a = 4;
    local_c = 4;
    local_e = 4;
    local_10 = 4;
    local_12c8 = 0x4000400040004;
    uStack_12c0 = 0x4000400040004;
    uVar1 = *(undefined8 *)*local_1050;
    uStack_e30 = *(undefined8 *)(*local_1050 + 8);
    local_e48 = local_10b8;
    uStack_e40 = uStack_10b0;
    local_e38._0_1_ = (undefined1)uVar1;
    local_e38._1_1_ = (undefined1)((ulong)uVar1 >> 8);
    local_e38._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
    local_e38._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
    local_e38._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
    local_e38._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
    local_e38._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
    local_e38._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
    local_10f8 = (undefined1)local_e38;
    cStack_10f7 = (char)local_d78;
    uStack_10f6 = local_e38._1_1_;
    cStack_10f5 = local_d78._1_1_;
    uStack_10f4 = local_e38._2_1_;
    cStack_10f3 = local_d78._2_1_;
    uStack_10f2 = local_e38._3_1_;
    cStack_10f1 = local_d78._3_1_;
    uStack_10f0 = local_e38._4_1_;
    cStack_10ef = local_d78._4_1_;
    uStack_10ee = local_e38._5_1_;
    cStack_10ed = local_d78._5_1_;
    uStack_10ec = local_e38._6_1_;
    cStack_10eb = local_d78._6_1_;
    uStack_10ea = local_e38._7_1_;
    cStack_10e9 = local_d78._7_1_;
    uVar2 = *local_1060;
    uStack_e50 = local_1060[1];
    local_e68 = local_10b8;
    uStack_e60 = uStack_10b0;
    local_e58._0_1_ = (undefined1)uVar2;
    local_e58._1_1_ = (undefined1)((ulong)uVar2 >> 8);
    local_e58._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
    local_e58._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
    local_e58._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
    local_e58._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
    local_e58._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
    local_e58._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
    local_1118 = (undefined1)local_e58;
    cStack_1117 = (char)local_d78;
    uStack_1116 = local_e58._1_1_;
    cStack_1115 = local_d78._1_1_;
    uStack_1114 = local_e58._2_1_;
    cStack_1113 = local_d78._2_1_;
    uStack_1112 = local_e58._3_1_;
    cStack_1111 = local_d78._3_1_;
    uStack_1110 = local_e58._4_1_;
    cStack_110f = local_d78._4_1_;
    uStack_110e = local_e58._5_1_;
    cStack_110d = local_d78._5_1_;
    uStack_110c = local_e58._6_1_;
    cStack_110b = local_d78._6_1_;
    uStack_110a = local_e58._7_1_;
    cStack_1109 = local_d78._7_1_;
    uVar3 = *local_1070;
    uStack_e70 = local_1070[1];
    local_e88 = local_10b8;
    uStack_e80 = uStack_10b0;
    local_e78._0_1_ = (undefined1)uVar3;
    local_e78._1_1_ = (undefined1)((ulong)uVar3 >> 8);
    local_e78._2_1_ = (undefined1)((ulong)uVar3 >> 0x10);
    local_e78._3_1_ = (undefined1)((ulong)uVar3 >> 0x18);
    local_e78._4_1_ = (undefined1)((ulong)uVar3 >> 0x20);
    local_e78._5_1_ = (undefined1)((ulong)uVar3 >> 0x28);
    local_e78._6_1_ = (undefined1)((ulong)uVar3 >> 0x30);
    local_e78._7_1_ = (undefined1)((ulong)uVar3 >> 0x38);
    local_1128 = (undefined1)local_e78;
    cStack_1127 = (char)local_d78;
    uStack_1126 = local_e78._1_1_;
    cStack_1125 = local_d78._1_1_;
    uStack_1124 = local_e78._2_1_;
    cStack_1123 = local_d78._2_1_;
    uStack_1122 = local_e78._3_1_;
    cStack_1121 = local_d78._3_1_;
    uStack_1120 = local_e78._4_1_;
    cStack_111f = local_d78._4_1_;
    uStack_111e = local_e78._5_1_;
    cStack_111d = local_d78._5_1_;
    uStack_111c = local_e78._6_1_;
    cStack_111b = local_d78._6_1_;
    uStack_111a = local_e78._7_1_;
    cStack_1119 = local_d78._7_1_;
    uVar4 = *local_1078;
    uStack_e90 = local_1078[1];
    local_ea8 = local_10b8;
    uStack_ea0 = uStack_10b0;
    local_e98._0_1_ = (undefined1)uVar4;
    local_e98._1_1_ = (undefined1)((ulong)uVar4 >> 8);
    local_e98._2_1_ = (undefined1)((ulong)uVar4 >> 0x10);
    local_e98._3_1_ = (undefined1)((ulong)uVar4 >> 0x18);
    local_e98._4_1_ = (undefined1)((ulong)uVar4 >> 0x20);
    local_e98._5_1_ = (undefined1)((ulong)uVar4 >> 0x28);
    local_e98._6_1_ = (undefined1)((ulong)uVar4 >> 0x30);
    local_e98._7_1_ = (undefined1)((ulong)uVar4 >> 0x38);
    local_1138 = (undefined1)local_e98;
    cStack_1137 = (char)local_d78;
    uStack_1136 = local_e98._1_1_;
    cStack_1135 = local_d78._1_1_;
    uStack_1134 = local_e98._2_1_;
    cStack_1133 = local_d78._2_1_;
    uStack_1132 = local_e98._3_1_;
    cStack_1131 = local_d78._3_1_;
    uStack_1130 = local_e98._4_1_;
    cStack_112f = local_d78._4_1_;
    uStack_112e = local_e98._5_1_;
    cStack_112d = local_d78._5_1_;
    uStack_112c = local_e98._6_1_;
    cStack_112b = local_d78._6_1_;
    uStack_112a = local_e98._7_1_;
    cStack_1129 = local_d78._7_1_;
    uVar5 = *local_1068;
    uStack_eb0 = local_1068[1];
    local_ec8 = local_10b8;
    uStack_ec0 = uStack_10b0;
    local_eb8._0_1_ = (undefined1)uVar5;
    local_eb8._1_1_ = (undefined1)((ulong)uVar5 >> 8);
    local_eb8._2_1_ = (undefined1)((ulong)uVar5 >> 0x10);
    local_eb8._3_1_ = (undefined1)((ulong)uVar5 >> 0x18);
    local_eb8._4_1_ = (undefined1)((ulong)uVar5 >> 0x20);
    local_eb8._5_1_ = (undefined1)((ulong)uVar5 >> 0x28);
    local_eb8._6_1_ = (undefined1)((ulong)uVar5 >> 0x30);
    local_eb8._7_1_ = (undefined1)((ulong)uVar5 >> 0x38);
    local_1148 = (undefined1)local_eb8;
    cStack_1147 = (char)local_d78;
    uStack_1146 = local_eb8._1_1_;
    cStack_1145 = local_d78._1_1_;
    uStack_1144 = local_eb8._2_1_;
    cStack_1143 = local_d78._2_1_;
    uStack_1142 = local_eb8._3_1_;
    cStack_1141 = local_d78._3_1_;
    uStack_1140 = local_eb8._4_1_;
    cStack_113f = local_d78._4_1_;
    uStack_113e = local_eb8._5_1_;
    cStack_113d = local_d78._5_1_;
    uStack_113c = local_eb8._6_1_;
    cStack_113b = local_d78._6_1_;
    uStack_113a = local_eb8._7_1_;
    cStack_1139 = local_d78._7_1_;
    uVar6 = *(undefined8 *)*local_1058;
    uStack_ed0 = *(undefined8 *)(*local_1058 + 8);
    local_ee8 = local_10b8;
    uStack_ee0 = uStack_10b0;
    local_ed8._0_1_ = (undefined1)uVar6;
    local_ed8._1_1_ = (undefined1)((ulong)uVar6 >> 8);
    local_ed8._2_1_ = (undefined1)((ulong)uVar6 >> 0x10);
    local_ed8._3_1_ = (undefined1)((ulong)uVar6 >> 0x18);
    local_ed8._4_1_ = (undefined1)((ulong)uVar6 >> 0x20);
    local_ed8._5_1_ = (undefined1)((ulong)uVar6 >> 0x28);
    local_ed8._6_1_ = (undefined1)((ulong)uVar6 >> 0x30);
    local_ed8._7_1_ = (undefined1)((ulong)uVar6 >> 0x38);
    local_1108 = (undefined1)local_ed8;
    cStack_1107 = (char)local_d78;
    uStack_1106 = local_ed8._1_1_;
    cStack_1105 = local_d78._1_1_;
    uStack_1104 = local_ed8._2_1_;
    cStack_1103 = local_d78._2_1_;
    uStack_1102 = local_ed8._3_1_;
    cStack_1101 = local_d78._3_1_;
    uStack_1100 = local_ed8._4_1_;
    cStack_10ff = local_d78._4_1_;
    uStack_10fe = local_ed8._5_1_;
    cStack_10fd = local_d78._5_1_;
    uStack_10fc = local_ed8._6_1_;
    cStack_10fb = local_d78._6_1_;
    uStack_10fa = local_ed8._7_1_;
    cStack_10f9 = local_d78._7_1_;
    uVar7 = *local_1040;
    uStack_ef0 = local_1040[1];
    local_f08 = local_10b8;
    uStack_f00 = uStack_10b0;
    local_ef8._0_1_ = (undefined1)uVar7;
    local_ef8._1_1_ = (undefined1)((ulong)uVar7 >> 8);
    local_ef8._2_1_ = (undefined1)((ulong)uVar7 >> 0x10);
    local_ef8._3_1_ = (undefined1)((ulong)uVar7 >> 0x18);
    local_ef8._4_1_ = (undefined1)((ulong)uVar7 >> 0x20);
    local_ef8._5_1_ = (undefined1)((ulong)uVar7 >> 0x28);
    local_ef8._6_1_ = (undefined1)((ulong)uVar7 >> 0x30);
    local_ef8._7_1_ = (undefined1)((ulong)uVar7 >> 0x38);
    local_1158 = (undefined1)local_ef8;
    cStack_1157 = (char)local_d78;
    uStack_1156 = local_ef8._1_1_;
    cStack_1155 = local_d78._1_1_;
    uStack_1154 = local_ef8._2_1_;
    cStack_1153 = local_d78._2_1_;
    uStack_1152 = local_ef8._3_1_;
    cStack_1151 = local_d78._3_1_;
    uStack_1150 = local_ef8._4_1_;
    cStack_114f = local_d78._4_1_;
    uStack_114e = local_ef8._5_1_;
    cStack_114d = local_d78._5_1_;
    uStack_114c = local_ef8._6_1_;
    cStack_114b = local_d78._6_1_;
    uStack_114a = local_ef8._7_1_;
    cStack_1149 = local_d78._7_1_;
    uVar8 = *local_1048;
    uStack_f10 = local_1048[1];
    local_f28 = local_10b8;
    uStack_f20 = uStack_10b0;
    local_f18._0_1_ = (undefined1)uVar8;
    local_f18._1_1_ = (undefined1)((ulong)uVar8 >> 8);
    local_f18._2_1_ = (undefined1)((ulong)uVar8 >> 0x10);
    local_f18._3_1_ = (undefined1)((ulong)uVar8 >> 0x18);
    local_f18._4_1_ = (undefined1)((ulong)uVar8 >> 0x20);
    local_f18._5_1_ = (undefined1)((ulong)uVar8 >> 0x28);
    local_f18._6_1_ = (undefined1)((ulong)uVar8 >> 0x30);
    local_f18._7_1_ = (undefined1)((ulong)uVar8 >> 0x38);
    local_1168 = (undefined1)local_f18;
    cStack_1167 = (char)local_d78;
    uStack_1166 = local_f18._1_1_;
    cStack_1165 = local_d78._1_1_;
    uStack_1164 = local_f18._2_1_;
    cStack_1163 = local_d78._2_1_;
    uStack_1162 = local_f18._3_1_;
    cStack_1161 = local_d78._3_1_;
    uStack_1160 = local_f18._4_1_;
    cStack_115f = local_d78._4_1_;
    uStack_115e = local_f18._5_1_;
    cStack_115d = local_d78._5_1_;
    uStack_115c = local_f18._6_1_;
    cStack_115b = local_d78._6_1_;
    uStack_115a = local_f18._7_1_;
    cStack_1159 = local_d78._7_1_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_ef8._1_1_,CONCAT11((char)local_d78,(undefined1)local_ef8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_ef8._2_1_,uVar10));
    local_618 = CONCAT17(local_d78._3_1_,CONCAT16(local_ef8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_ef8._5_1_,CONCAT11(local_d78._4_1_,local_ef8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_ef8._6_1_,uVar15));
    uStack_610 = CONCAT17(local_d78._7_1_,CONCAT16(local_ef8._7_1_,uVar16));
    local_608._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_608._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_608._6_2_ = (short)((ulong)local_618 >> 0x30);
    uStack_600._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_600._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_600._6_2_ = (short)((ulong)uStack_610 >> 0x30);
    local_648 = CONCAT11((char)local_d78,(undefined1)local_ef8) * 2;
    sStack_646 = local_608._2_2_ * 2;
    sStack_644 = local_608._4_2_ * 2;
    sStack_642 = local_608._6_2_ * 2;
    sStack_640 = CONCAT11(local_d78._4_1_,local_ef8._4_1_) * 2;
    sStack_63e = uStack_600._2_2_ * 2;
    sStack_63c = uStack_600._4_2_ * 2;
    sStack_63a = uStack_600._6_2_ * 2;
    uVar33 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e38._1_1_,CONCAT11((char)local_d78,(undefined1)local_e38)));
    uVar34 = CONCAT15(local_d78._2_1_,CONCAT14(local_e38._2_1_,uVar33));
    uVar61 = CONCAT17(local_d78._3_1_,CONCAT16(local_e38._3_1_,uVar34));
    uVar39 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e38._5_1_,CONCAT11(local_d78._4_1_,local_e38._4_1_)));
    uVar40 = CONCAT15(local_d78._6_1_,CONCAT14(local_e38._6_1_,uVar39));
    uVar64 = CONCAT17(local_d78._7_1_,CONCAT16(local_e38._7_1_,uVar40));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e58._1_1_,CONCAT11((char)local_d78,(undefined1)local_e58)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e58._2_1_,uVar10));
    uVar49 = CONCAT17(local_d78._3_1_,CONCAT16(local_e58._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e58._5_1_,CONCAT11(local_d78._4_1_,local_e58._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e58._6_1_,uVar15));
    uVar53 = CONCAT17(local_d78._7_1_,CONCAT16(local_e58._7_1_,uVar16));
    local_628._2_2_ = (short)((uint)uVar33 >> 0x10);
    local_628._4_2_ = (short)((uint6)uVar34 >> 0x20);
    local_628._6_2_ = (short)((ulong)uVar61 >> 0x30);
    uStack_620._2_2_ = (short)((uint)uVar39 >> 0x10);
    uStack_620._4_2_ = (short)((uint6)uVar40 >> 0x20);
    uStack_620._6_2_ = (short)((ulong)uVar64 >> 0x30);
    local_638._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_638._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_638._6_2_ = (short)((ulong)uVar49 >> 0x30);
    uStack_630._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_630._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_630._6_2_ = (short)((ulong)uVar53 >> 0x30);
    local_658 = CONCAT11((char)local_d78,(undefined1)local_e38) +
                CONCAT11((char)local_d78,(undefined1)local_e58);
    sStack_656 = local_628._2_2_ + local_638._2_2_;
    sStack_654 = local_628._4_2_ + local_638._4_2_;
    sStack_652 = local_628._6_2_ + local_638._6_2_;
    sStack_650 = CONCAT11(local_d78._4_1_,local_e38._4_1_) +
                 CONCAT11(local_d78._4_1_,local_e58._4_1_);
    sStack_64e = uStack_620._2_2_ + uStack_630._2_2_;
    sStack_64c = uStack_620._4_2_ + uStack_630._4_2_;
    sStack_64a = uStack_620._6_2_ + uStack_630._6_2_;
    local_668 = CONCAT26(sStack_642 + sStack_652,
                         CONCAT24(sStack_644 + sStack_654,
                                  CONCAT22(sStack_646 + sStack_656,local_648 + local_658)));
    uStack_660 = CONCAT26(sStack_63a + sStack_64a,
                          CONCAT24(sStack_63c + sStack_64c,
                                   CONCAT22(sStack_63e + sStack_64e,sStack_640 + sStack_650)));
    local_688 = local_648 + local_658 + 4;
    sStack_686 = sStack_646 + sStack_656 + 4;
    sStack_684 = sStack_644 + sStack_654 + 4;
    sStack_682 = sStack_642 + sStack_652 + 4;
    sStack_680 = sStack_640 + sStack_650 + 4;
    sStack_67e = sStack_63e + sStack_64e + 4;
    sStack_67c = sStack_63c + sStack_64c + 4;
    sStack_67a = sStack_63a + sStack_64a + 4;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e78._1_1_,CONCAT11((char)local_d78,(undefined1)local_e78)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e78._2_1_,uVar10));
    uVar43 = CONCAT17(local_d78._3_1_,CONCAT16(local_e78._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e78._5_1_,CONCAT11(local_d78._4_1_,local_e78._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e78._6_1_,uVar15));
    uVar46 = CONCAT17(local_d78._7_1_,CONCAT16(local_e78._7_1_,uVar16));
    local_698._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_698._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_698._6_2_ = (short)((ulong)uVar43 >> 0x30);
    uStack_690._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_690._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_690._6_2_ = (short)((ulong)uVar46 >> 0x30);
    sVar89 = local_688 + CONCAT11((char)local_d78,(undefined1)local_e78);
    local_698._2_2_ = sStack_686 + local_698._2_2_;
    local_698._4_2_ = sStack_684 + local_698._4_2_;
    local_698._6_2_ = sStack_682 + local_698._6_2_;
    sStack_760 = sStack_680 + CONCAT11(local_d78._4_1_,local_e78._4_1_);
    uStack_690._2_2_ = sStack_67e + uStack_690._2_2_;
    uStack_690._4_2_ = sStack_67c + uStack_690._4_2_;
    uStack_690._6_2_ = sStack_67a + uStack_690._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e98._1_1_,CONCAT11((char)local_d78,(undefined1)local_e98)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e98._2_1_,uVar10));
    uVar31 = CONCAT17(local_d78._3_1_,CONCAT16(local_e98._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e98._5_1_,CONCAT11(local_d78._4_1_,local_e98._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e98._6_1_,uVar15));
    uVar37 = CONCAT17(local_d78._7_1_,CONCAT16(local_e98._7_1_,uVar16));
    uVar33 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e38._1_1_,CONCAT11((char)local_d78,(undefined1)local_e38)));
    uVar34 = CONCAT15(local_d78._2_1_,CONCAT14(local_e38._2_1_,uVar33));
    uVar62 = CONCAT17(local_d78._3_1_,CONCAT16(local_e38._3_1_,uVar34));
    uVar39 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e38._5_1_,CONCAT11(local_d78._4_1_,local_e38._4_1_)));
    uVar40 = CONCAT15(local_d78._6_1_,CONCAT14(local_e38._6_1_,uVar39));
    uVar65 = CONCAT17(local_d78._7_1_,CONCAT16(local_e38._7_1_,uVar40));
    local_6a8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_6a8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_6a8._6_2_ = (short)((ulong)uVar31 >> 0x30);
    uStack_6a0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_6a0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_6a0._6_2_ = (short)((ulong)uVar37 >> 0x30);
    local_6b8._2_2_ = (short)((uint)uVar33 >> 0x10);
    local_6b8._4_2_ = (short)((uint6)uVar34 >> 0x20);
    local_6b8._6_2_ = (short)((ulong)uVar62 >> 0x30);
    uStack_6b0._2_2_ = (short)((uint)uVar39 >> 0x10);
    uStack_6b0._4_2_ = (short)((uint6)uVar40 >> 0x20);
    uStack_6b0._6_2_ = (short)((ulong)uVar65 >> 0x30);
    local_6c8 = CONCAT11((char)local_d78,(undefined1)local_e98) +
                CONCAT11((char)local_d78,(undefined1)local_e38);
    sStack_6c6 = local_6a8._2_2_ + local_6b8._2_2_;
    sStack_6c4 = local_6a8._4_2_ + local_6b8._4_2_;
    sStack_6c2 = local_6a8._6_2_ + local_6b8._6_2_;
    sStack_6c0 = CONCAT11(local_d78._4_1_,local_e98._4_1_) +
                 CONCAT11(local_d78._4_1_,local_e38._4_1_);
    sStack_6be = uStack_6a0._2_2_ + uStack_6b0._2_2_;
    sStack_6bc = uStack_6a0._4_2_ + uStack_6b0._4_2_;
    sStack_6ba = uStack_6a0._6_2_ + uStack_6b0._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_ef8._1_1_,CONCAT11((char)local_d78,(undefined1)local_ef8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_ef8._2_1_,uVar10));
    uVar19 = CONCAT17(local_d78._3_1_,CONCAT16(local_ef8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_ef8._5_1_,CONCAT11(local_d78._4_1_,local_ef8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_ef8._6_1_,uVar15));
    uVar22 = CONCAT17(local_d78._7_1_,CONCAT16(local_ef8._7_1_,uVar16));
    local_6d8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_6d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_6d8._6_2_ = (short)((ulong)uVar19 >> 0x30);
    uStack_6d0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_6d0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_6d0._6_2_ = (short)((ulong)uVar22 >> 0x30);
    sVar90 = local_6c8 + CONCAT11((char)local_d78,(undefined1)local_ef8);
    sStack_1320 = sStack_6c0 + CONCAT11(local_d78._4_1_,local_ef8._4_1_);
    local_6e8 = CONCAT26(local_698._6_2_,CONCAT24(local_698._4_2_,CONCAT22(local_698._2_2_,sVar89)))
    ;
    uStack_6e0 = CONCAT26(uStack_690._6_2_,
                          CONCAT24(uStack_690._4_2_,CONCAT22(uStack_690._2_2_,sStack_760)));
    local_6f8 = CONCAT26(sStack_6c2 + local_6d8._6_2_,
                         CONCAT24(sStack_6c4 + local_6d8._4_2_,
                                  CONCAT22(sStack_6c6 + local_6d8._2_2_,sVar90)));
    uStack_6f0 = CONCAT26(sStack_6ba + uStack_6d0._6_2_,
                          CONCAT24(sStack_6bc + uStack_6d0._4_2_,
                                   CONCAT22(sStack_6be + uStack_6d0._2_2_,sStack_1320)));
    local_1328 = sVar89 + sVar90;
    uStack_1326 = local_698._2_2_ + sStack_6c6 + local_6d8._2_2_;
    uStack_1324 = local_698._4_2_ + sStack_6c4 + local_6d8._4_2_;
    uStack_1322 = local_698._6_2_ + sStack_6c2 + local_6d8._6_2_;
    sStack_1320 = sStack_760 + sStack_1320;
    sStack_131e = uStack_690._2_2_ + sStack_6be + uStack_6d0._2_2_;
    sStack_131c = uStack_690._4_2_ + sStack_6bc + uStack_6d0._4_2_;
    sStack_131a = uStack_690._6_2_ + sStack_6ba + uStack_6d0._6_2_;
    uVar33 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e98._1_1_,CONCAT11((char)local_d78,(undefined1)local_e98)));
    uVar34 = CONCAT15(local_d78._2_1_,CONCAT14(local_e98._2_1_,uVar33));
    uVar32 = CONCAT17(local_d78._3_1_,CONCAT16(local_e98._3_1_,uVar34));
    uVar39 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e98._5_1_,CONCAT11(local_d78._4_1_,local_e98._4_1_)));
    uVar40 = CONCAT15(local_d78._6_1_,CONCAT14(local_e98._6_1_,uVar39));
    uVar38 = CONCAT17(local_d78._7_1_,CONCAT16(local_e98._7_1_,uVar40));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_eb8._1_1_,CONCAT11((char)local_d78,(undefined1)local_eb8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_eb8._2_1_,uVar10));
    uVar25 = CONCAT17(local_d78._3_1_,CONCAT16(local_eb8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_eb8._5_1_,CONCAT11(local_d78._4_1_,local_eb8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_eb8._6_1_,uVar15));
    uVar28 = CONCAT17(local_d78._7_1_,CONCAT16(local_eb8._7_1_,uVar16));
    local_708._2_2_ = (short)((uint)uVar33 >> 0x10);
    local_708._4_2_ = (short)((uint6)uVar34 >> 0x20);
    local_708._6_2_ = (short)((ulong)uVar32 >> 0x30);
    uStack_700._2_2_ = (short)((uint)uVar39 >> 0x10);
    uStack_700._4_2_ = (short)((uint6)uVar40 >> 0x20);
    uStack_700._6_2_ = (short)((ulong)uVar38 >> 0x30);
    local_718._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_718._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_718._6_2_ = (short)((ulong)uVar25 >> 0x30);
    uStack_710._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_710._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_710._6_2_ = (short)((ulong)uVar28 >> 0x30);
    local_728 = CONCAT11((char)local_d78,(undefined1)local_e98) +
                CONCAT11((char)local_d78,(undefined1)local_eb8);
    sStack_726 = local_708._2_2_ + local_718._2_2_;
    sStack_724 = local_708._4_2_ + local_718._4_2_;
    sStack_722 = local_708._6_2_ + local_718._6_2_;
    sStack_720 = CONCAT11(local_d78._4_1_,local_e98._4_1_) +
                 CONCAT11(local_d78._4_1_,local_eb8._4_1_);
    sStack_71e = uStack_700._2_2_ + uStack_710._2_2_;
    sStack_71c = uStack_700._4_2_ + uStack_710._4_2_;
    sStack_71a = uStack_700._6_2_ + uStack_710._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e58._1_1_,CONCAT11((char)local_d78,(undefined1)local_e58)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e58._2_1_,uVar10));
    uVar50 = CONCAT17(local_d78._3_1_,CONCAT16(local_e58._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e58._5_1_,CONCAT11(local_d78._4_1_,local_e58._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e58._6_1_,uVar15));
    uVar54 = CONCAT17(local_d78._7_1_,CONCAT16(local_e58._7_1_,uVar16));
    local_738._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_738._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_738._6_2_ = (short)((ulong)uVar50 >> 0x30);
    uStack_730._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_730._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_730._6_2_ = (short)((ulong)uVar54 >> 0x30);
    sVar90 = local_728 + CONCAT11((char)local_d78,(undefined1)local_e58);
    local_738._2_2_ = sStack_726 + local_738._2_2_;
    local_738._4_2_ = sStack_724 + local_738._4_2_;
    local_738._6_2_ = sStack_722 + local_738._6_2_;
    sStack_780 = sStack_720 + CONCAT11(local_d78._4_1_,local_e58._4_1_);
    uStack_730._2_2_ = sStack_71e + uStack_730._2_2_;
    uStack_730._4_2_ = sStack_71c + uStack_730._4_2_;
    uStack_730._6_2_ = sStack_71a + uStack_730._6_2_;
    local_748 = CONCAT26(local_698._6_2_,CONCAT24(local_698._4_2_,CONCAT22(local_698._2_2_,sVar89)))
    ;
    uStack_740 = CONCAT26(uStack_690._6_2_,
                          CONCAT24(uStack_690._4_2_,CONCAT22(uStack_690._2_2_,sStack_760)));
    local_758 = CONCAT26(local_738._6_2_,CONCAT24(local_738._4_2_,CONCAT22(local_738._2_2_,sVar90)))
    ;
    uStack_750 = CONCAT26(uStack_730._6_2_,
                          CONCAT24(uStack_730._4_2_,CONCAT22(uStack_730._2_2_,sStack_780)));
    local_12f8._0_4_ = CONCAT22(local_698._2_2_ + local_738._2_2_,sVar89 + sVar90);
    local_12f8._0_6_ = CONCAT24(local_698._4_2_ + local_738._4_2_,(undefined4)local_12f8);
    local_12f8 = CONCAT26(local_698._6_2_ + local_738._6_2_,(undefined6)local_12f8);
    uStack_12f0._0_4_ = CONCAT22(uStack_690._2_2_ + uStack_730._2_2_,sStack_760 + sStack_780);
    uStack_12f0._0_6_ = CONCAT24(uStack_690._4_2_ + uStack_730._4_2_,(undefined4)uStack_12f0);
    uStack_12f0 = CONCAT26(uStack_690._6_2_ + uStack_730._6_2_,(undefined6)uStack_12f0);
    local_508 = CONCAT26(local_698._6_2_,CONCAT24(local_698._4_2_,CONCAT22(local_698._2_2_,sVar89)))
    ;
    uStack_500 = CONCAT26(uStack_690._6_2_,
                          CONCAT24(uStack_690._4_2_,CONCAT22(uStack_690._2_2_,sStack_760)));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_ef8._1_1_,CONCAT11((char)local_d78,(undefined1)local_ef8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_ef8._2_1_,uVar10));
    uVar20 = CONCAT17(local_d78._3_1_,CONCAT16(local_ef8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_ef8._5_1_,CONCAT11(local_d78._4_1_,local_ef8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_ef8._6_1_,uVar15));
    uVar23 = CONCAT17(local_d78._7_1_,CONCAT16(local_ef8._7_1_,uVar16));
    local_518._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_518._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_518._6_2_ = (short)((ulong)uVar20 >> 0x30);
    uStack_510._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_510._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_510._6_2_ = (short)((ulong)uVar23 >> 0x30);
    local_768 = sVar89 - CONCAT11((char)local_d78,(undefined1)local_ef8);
    sStack_766 = local_698._2_2_ - local_518._2_2_;
    sStack_764 = local_698._4_2_ - local_518._4_2_;
    sStack_762 = local_698._6_2_ - local_518._6_2_;
    sStack_760 = sStack_760 - CONCAT11(local_d78._4_1_,local_ef8._4_1_);
    sStack_75e = uStack_690._2_2_ - uStack_510._2_2_;
    sStack_75c = uStack_690._4_2_ - uStack_510._4_2_;
    sStack_75a = uStack_690._6_2_ - uStack_510._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_ed8._1_1_,CONCAT11((char)local_d78,(undefined1)local_ed8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_ed8._2_1_,uVar10));
    uVar57 = CONCAT17(local_d78._3_1_,CONCAT16(local_ed8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_ed8._5_1_,CONCAT11(local_d78._4_1_,local_ed8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_ed8._6_1_,uVar15));
    uVar59 = CONCAT17(local_d78._7_1_,CONCAT16(local_ed8._7_1_,uVar16));
    local_778._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_778._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_778._6_2_ = (short)((ulong)uVar57 >> 0x30);
    uStack_770._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_770._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_770._6_2_ = (short)((ulong)uVar59 >> 0x30);
    local_7c8 = local_768 + CONCAT11((char)local_d78,(undefined1)local_ed8);
    local_778._2_2_ = sStack_766 + local_778._2_2_;
    local_778._4_2_ = sStack_764 + local_778._4_2_;
    local_778._6_2_ = sStack_762 + local_778._6_2_;
    sStack_7c0 = sStack_760 + CONCAT11(local_d78._4_1_,local_ed8._4_1_);
    uStack_770._2_2_ = sStack_75e + uStack_770._2_2_;
    uStack_770._4_2_ = sStack_75c + uStack_770._4_2_;
    uStack_770._6_2_ = sStack_75a + uStack_770._6_2_;
    local_528 = CONCAT26(local_738._6_2_,CONCAT24(local_738._4_2_,CONCAT22(local_738._2_2_,sVar90)))
    ;
    uStack_520 = CONCAT26(uStack_730._6_2_,
                          CONCAT24(uStack_730._4_2_,CONCAT22(uStack_730._2_2_,sStack_780)));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e58._1_1_,CONCAT11((char)local_d78,(undefined1)local_e58)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e58._2_1_,uVar10));
    uVar51 = CONCAT17(local_d78._3_1_,CONCAT16(local_e58._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e58._5_1_,CONCAT11(local_d78._4_1_,local_e58._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e58._6_1_,uVar15));
    uVar55 = CONCAT17(local_d78._7_1_,CONCAT16(local_e58._7_1_,uVar16));
    local_538._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_538._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_538._6_2_ = (short)((ulong)uVar51 >> 0x30);
    uStack_530._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_530._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_530._6_2_ = (short)((ulong)uVar55 >> 0x30);
    local_788 = sVar90 - CONCAT11((char)local_d78,(undefined1)local_e58);
    sStack_786 = local_738._2_2_ - local_538._2_2_;
    sStack_784 = local_738._4_2_ - local_538._4_2_;
    sStack_782 = local_738._6_2_ - local_538._6_2_;
    sStack_780 = sStack_780 - CONCAT11(local_d78._4_1_,local_e58._4_1_);
    sStack_77e = uStack_730._2_2_ - uStack_530._2_2_;
    sStack_77c = uStack_730._4_2_ - uStack_530._4_2_;
    sStack_77a = uStack_730._6_2_ - uStack_530._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e78._1_1_,CONCAT11((char)local_d78,(undefined1)local_e78)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e78._2_1_,uVar10));
    uVar44 = CONCAT17(local_d78._3_1_,CONCAT16(local_e78._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e78._5_1_,CONCAT11(local_d78._4_1_,local_e78._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e78._6_1_,uVar15));
    uVar47 = CONCAT17(local_d78._7_1_,CONCAT16(local_e78._7_1_,uVar16));
    local_798._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_798._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_798._6_2_ = (short)((ulong)uVar44 >> 0x30);
    uStack_790._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_790._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_790._6_2_ = (short)((ulong)uVar47 >> 0x30);
    local_7e8 = local_788 + CONCAT11((char)local_d78,(undefined1)local_e78);
    local_798._2_2_ = sStack_786 + local_798._2_2_;
    local_798._4_2_ = sStack_784 + local_798._4_2_;
    local_798._6_2_ = sStack_782 + local_798._6_2_;
    sStack_7e0 = sStack_780 + CONCAT11(local_d78._4_1_,local_e78._4_1_);
    uStack_790._2_2_ = sStack_77e + uStack_790._2_2_;
    uStack_790._4_2_ = sStack_77c + uStack_790._4_2_;
    uStack_790._6_2_ = sStack_77a + uStack_790._6_2_;
    local_7a8 = CONCAT26(local_778._6_2_,
                         CONCAT24(local_778._4_2_,CONCAT22(local_778._2_2_,local_7c8)));
    uStack_7a0 = CONCAT26(uStack_770._6_2_,
                          CONCAT24(uStack_770._4_2_,CONCAT22(uStack_770._2_2_,sStack_7c0)));
    local_7b8 = CONCAT26(local_798._6_2_,
                         CONCAT24(local_798._4_2_,CONCAT22(local_798._2_2_,local_7e8)));
    uStack_7b0 = CONCAT26(uStack_790._6_2_,
                          CONCAT24(uStack_790._4_2_,CONCAT22(uStack_790._2_2_,sStack_7e0)));
    local_dd8 = CONCAT26(local_778._6_2_ + local_798._6_2_,
                         CONCAT24(local_778._4_2_ + local_798._4_2_,
                                  CONCAT22(local_778._2_2_ + local_798._2_2_,local_7c8 + local_7e8))
                        );
    uStack_dd0 = CONCAT26(uStack_770._6_2_ + uStack_790._6_2_,
                          CONCAT24(uStack_770._4_2_ + uStack_790._4_2_,
                                   CONCAT22(uStack_770._2_2_ + uStack_790._2_2_,
                                            sStack_7c0 + sStack_7e0)));
    local_de8 = local_12f8;
    uStack_de0 = uStack_12f0;
    uStack_b40 = local_12f8;
    local_b4c = 3;
    uVar91 = (ushort)(local_7c8 + local_7e8) >> 3;
    uVar97 = (ushort)(local_778._2_2_ + local_798._2_2_) >> 3;
    uVar98 = (ushort)(local_778._4_2_ + local_798._4_2_) >> 3;
    uVar99 = (ushort)(local_778._6_2_ + local_798._6_2_) >> 3;
    uVar101 = (ushort)(sVar89 + sVar90) >> 3;
    uVar106 = (ushort)(local_698._2_2_ + local_738._2_2_) >> 3;
    uVar109 = (ushort)(local_698._4_2_ + local_738._4_2_) >> 3;
    uVar112 = (ushort)(local_698._6_2_ + local_738._6_2_) >> 3;
    local_12f8._0_4_ = CONCAT22(uVar97,uVar91);
    local_12f8._0_6_ = CONCAT24(uVar98,(undefined4)local_12f8);
    local_12f8 = CONCAT26(uVar99,(undefined6)local_12f8);
    uStack_12f0._0_4_ = CONCAT22(uVar106,uVar101);
    uStack_12f0._0_6_ = CONCAT24(uVar109,(undefined4)uStack_12f0);
    uStack_12f0 = CONCAT26(uVar112,(undefined6)uStack_12f0);
    local_38 = local_12f8;
    uStack_30 = uStack_12f0;
    local_48 = local_12f8;
    uStack_40 = uStack_12f0;
    local_1188 = (uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91);
    cStack_1187 = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
    cStack_1186 = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
    cStack_1185 = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    cStack_1184 = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
    cStack_1183 = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    cStack_1182 = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
    cStack_1181 = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
    cStack_1180 = (uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91);
    cStack_117f = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
    cStack_117e = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
    cStack_117d = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    cStack_117c = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
    cStack_117b = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    cStack_117a = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
    cStack_1179 = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
    local_548 = CONCAT26(local_778._6_2_,
                         CONCAT24(local_778._4_2_,CONCAT22(local_778._2_2_,local_7c8)));
    uStack_540 = CONCAT26(uStack_770._6_2_,
                          CONCAT24(uStack_770._4_2_,CONCAT22(uStack_770._2_2_,sStack_7c0)));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_ef8._1_1_,CONCAT11((char)local_d78,(undefined1)local_ef8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_ef8._2_1_,uVar10));
    uVar21 = CONCAT17(local_d78._3_1_,CONCAT16(local_ef8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_ef8._5_1_,CONCAT11(local_d78._4_1_,local_ef8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_ef8._6_1_,uVar15));
    uVar24 = CONCAT17(local_d78._7_1_,CONCAT16(local_ef8._7_1_,uVar16));
    local_558._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_558._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_558._6_2_ = (short)((ulong)uVar21 >> 0x30);
    uStack_550._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_550._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_550._6_2_ = (short)((ulong)uVar24 >> 0x30);
    local_7c8 = local_7c8 - CONCAT11((char)local_d78,(undefined1)local_ef8);
    sStack_7c6 = local_778._2_2_ - local_558._2_2_;
    sStack_7c4 = local_778._4_2_ - local_558._4_2_;
    sStack_7c2 = local_778._6_2_ - local_558._6_2_;
    sStack_7c0 = sStack_7c0 - CONCAT11(local_d78._4_1_,local_ef8._4_1_);
    sStack_7be = uStack_770._2_2_ - uStack_550._2_2_;
    sStack_7bc = uStack_770._4_2_ - uStack_550._4_2_;
    sStack_7ba = uStack_770._6_2_ - uStack_550._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_f18._1_1_,CONCAT11((char)local_d78,(undefined1)local_f18)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_f18._2_1_,uVar10));
    uVar9 = CONCAT17(local_d78._3_1_,CONCAT16(local_f18._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_f18._5_1_,CONCAT11(local_d78._4_1_,local_f18._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_f18._6_1_,uVar15));
    uVar14 = CONCAT17(local_d78._7_1_,CONCAT16(local_f18._7_1_,uVar16));
    local_7d8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_7d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_7d8._6_2_ = (short)((ulong)uVar9 >> 0x30);
    uStack_7d0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_7d0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_7d0._6_2_ = (short)((ulong)uVar14 >> 0x30);
    sVar89 = local_7c8 + CONCAT11((char)local_d78,(undefined1)local_f18);
    local_7d8._2_2_ = sStack_7c6 + local_7d8._2_2_;
    local_7d8._4_2_ = sStack_7c4 + local_7d8._4_2_;
    local_7d8._6_2_ = sStack_7c2 + local_7d8._6_2_;
    sStack_820 = sStack_7c0 + CONCAT11(local_d78._4_1_,local_f18._4_1_);
    uStack_7d0._2_2_ = sStack_7be + uStack_7d0._2_2_;
    uStack_7d0._4_2_ = sStack_7bc + uStack_7d0._4_2_;
    uStack_7d0._6_2_ = sStack_7ba + uStack_7d0._6_2_;
    local_568 = CONCAT26(local_798._6_2_,
                         CONCAT24(local_798._4_2_,CONCAT22(local_798._2_2_,local_7e8)));
    uStack_560 = CONCAT26(uStack_790._6_2_,
                          CONCAT24(uStack_790._4_2_,CONCAT22(uStack_790._2_2_,sStack_7e0)));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e78._1_1_,CONCAT11((char)local_d78,(undefined1)local_e78)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e78._2_1_,uVar10));
    uVar45 = CONCAT17(local_d78._3_1_,CONCAT16(local_e78._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e78._5_1_,CONCAT11(local_d78._4_1_,local_e78._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e78._6_1_,uVar15));
    uVar48 = CONCAT17(local_d78._7_1_,CONCAT16(local_e78._7_1_,uVar16));
    local_578._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_578._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_578._6_2_ = (short)((ulong)uVar45 >> 0x30);
    uStack_570._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_570._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_570._6_2_ = (short)((ulong)uVar48 >> 0x30);
    local_7e8 = local_7e8 - CONCAT11((char)local_d78,(undefined1)local_e78);
    sStack_7e6 = local_798._2_2_ - local_578._2_2_;
    sStack_7e4 = local_798._4_2_ - local_578._4_2_;
    sStack_7e2 = local_798._6_2_ - local_578._6_2_;
    sStack_7e0 = sStack_7e0 - CONCAT11(local_d78._4_1_,local_e78._4_1_);
    sStack_7de = uStack_790._2_2_ - uStack_570._2_2_;
    sStack_7dc = uStack_790._4_2_ - uStack_570._4_2_;
    sStack_7da = uStack_790._6_2_ - uStack_570._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e98._1_1_,CONCAT11((char)local_d78,(undefined1)local_e98)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e98._2_1_,uVar10));
    uVar35 = CONCAT17(local_d78._3_1_,CONCAT16(local_e98._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e98._5_1_,CONCAT11(local_d78._4_1_,local_e98._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e98._6_1_,uVar15));
    uVar41 = CONCAT17(local_d78._7_1_,CONCAT16(local_e98._7_1_,uVar16));
    local_7f8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_7f8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_7f8._6_2_ = (short)((ulong)uVar35 >> 0x30);
    uStack_7f0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_7f0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_7f0._6_2_ = (short)((ulong)uVar41 >> 0x30);
    sVar90 = local_7e8 + CONCAT11((char)local_d78,(undefined1)local_e98);
    local_7f8._2_2_ = sStack_7e6 + local_7f8._2_2_;
    local_7f8._4_2_ = sStack_7e4 + local_7f8._4_2_;
    local_7f8._6_2_ = sStack_7e2 + local_7f8._6_2_;
    sStack_840 = sStack_7e0 + CONCAT11(local_d78._4_1_,local_e98._4_1_);
    uStack_7f0._2_2_ = sStack_7de + uStack_7f0._2_2_;
    uStack_7f0._4_2_ = sStack_7dc + uStack_7f0._4_2_;
    uStack_7f0._6_2_ = sStack_7da + uStack_7f0._6_2_;
    local_808 = CONCAT26(local_7d8._6_2_,CONCAT24(local_7d8._4_2_,CONCAT22(local_7d8._2_2_,sVar89)))
    ;
    uStack_800 = CONCAT26(uStack_7d0._6_2_,
                          CONCAT24(uStack_7d0._4_2_,CONCAT22(uStack_7d0._2_2_,sStack_820)));
    local_818 = CONCAT26(local_7f8._6_2_,CONCAT24(local_7f8._4_2_,CONCAT22(local_7f8._2_2_,sVar90)))
    ;
    uStack_810 = CONCAT26(uStack_7f0._6_2_,
                          CONCAT24(uStack_7f0._4_2_,CONCAT22(uStack_7f0._2_2_,sStack_840)));
    local_12f8._0_4_ = CONCAT22(local_7d8._2_2_ + local_7f8._2_2_,sVar89 + sVar90);
    local_12f8._0_6_ = CONCAT24(local_7d8._4_2_ + local_7f8._4_2_,(undefined4)local_12f8);
    local_12f8 = CONCAT26(local_7d8._6_2_ + local_7f8._6_2_,(undefined6)local_12f8);
    uStack_12f0._0_4_ = CONCAT22(uStack_7d0._2_2_ + uStack_7f0._2_2_,sStack_820 + sStack_840);
    uStack_12f0._0_6_ = CONCAT24(uStack_7d0._4_2_ + uStack_7f0._4_2_,(undefined4)uStack_12f0);
    uStack_12f0 = CONCAT26(uStack_7d0._6_2_ + uStack_7f0._6_2_,(undefined6)uStack_12f0);
    local_588 = CONCAT26(local_7d8._6_2_,CONCAT24(local_7d8._4_2_,CONCAT22(local_7d8._2_2_,sVar89)))
    ;
    uStack_580 = CONCAT26(uStack_7d0._6_2_,
                          CONCAT24(uStack_7d0._4_2_,CONCAT22(uStack_7d0._2_2_,sStack_820)));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e38._1_1_,CONCAT11((char)local_d78,(undefined1)local_e38)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e38._2_1_,uVar10));
    uVar63 = CONCAT17(local_d78._3_1_,CONCAT16(local_e38._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e38._5_1_,CONCAT11(local_d78._4_1_,local_e38._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e38._6_1_,uVar15));
    uVar66 = CONCAT17(local_d78._7_1_,CONCAT16(local_e38._7_1_,uVar16));
    local_598._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_598._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_598._6_2_ = (short)((ulong)uVar63 >> 0x30);
    uStack_590._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_590._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_590._6_2_ = (short)((ulong)uVar66 >> 0x30);
    local_828 = sVar89 - CONCAT11((char)local_d78,(undefined1)local_e38);
    sStack_826 = local_7d8._2_2_ - local_598._2_2_;
    sStack_824 = local_7d8._4_2_ - local_598._4_2_;
    sStack_822 = local_7d8._6_2_ - local_598._6_2_;
    sStack_820 = sStack_820 - CONCAT11(local_d78._4_1_,local_e38._4_1_);
    sStack_81e = uStack_7d0._2_2_ - uStack_590._2_2_;
    sStack_81c = uStack_7d0._4_2_ - uStack_590._4_2_;
    sStack_81a = uStack_7d0._6_2_ - uStack_590._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_f18._1_1_,CONCAT11((char)local_d78,(undefined1)local_f18)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_f18._2_1_,uVar10));
    uVar12 = CONCAT17(local_d78._3_1_,CONCAT16(local_f18._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_f18._5_1_,CONCAT11(local_d78._4_1_,local_f18._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_f18._6_1_,uVar15));
    uVar17 = CONCAT17(local_d78._7_1_,CONCAT16(local_f18._7_1_,uVar16));
    local_838._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_838._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_838._6_2_ = (short)((ulong)uVar12 >> 0x30);
    uStack_830._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_830._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_830._6_2_ = (short)((ulong)uVar17 >> 0x30);
    local_888 = local_828 + CONCAT11((char)local_d78,(undefined1)local_f18);
    local_838._2_2_ = sStack_826 + local_838._2_2_;
    local_838._4_2_ = sStack_824 + local_838._4_2_;
    local_838._6_2_ = sStack_822 + local_838._6_2_;
    sStack_880 = sStack_820 + CONCAT11(local_d78._4_1_,local_f18._4_1_);
    uStack_830._2_2_ = sStack_81e + uStack_830._2_2_;
    uStack_830._4_2_ = sStack_81c + uStack_830._4_2_;
    uStack_830._6_2_ = sStack_81a + uStack_830._6_2_;
    local_5a8 = CONCAT26(local_7f8._6_2_,CONCAT24(local_7f8._4_2_,CONCAT22(local_7f8._2_2_,sVar90)))
    ;
    uStack_5a0 = CONCAT26(uStack_7f0._6_2_,
                          CONCAT24(uStack_7f0._4_2_,CONCAT22(uStack_7f0._2_2_,sStack_840)));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e98._1_1_,CONCAT11((char)local_d78,(undefined1)local_e98)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e98._2_1_,uVar10));
    uVar36 = CONCAT17(local_d78._3_1_,CONCAT16(local_e98._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e98._5_1_,CONCAT11(local_d78._4_1_,local_e98._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e98._6_1_,uVar15));
    uVar42 = CONCAT17(local_d78._7_1_,CONCAT16(local_e98._7_1_,uVar16));
    local_5b8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5b8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5b8._6_2_ = (short)((ulong)uVar36 >> 0x30);
    uStack_5b0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_5b0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_5b0._6_2_ = (short)((ulong)uVar42 >> 0x30);
    local_848 = sVar90 - CONCAT11((char)local_d78,(undefined1)local_e98);
    sStack_846 = local_7f8._2_2_ - local_5b8._2_2_;
    sStack_844 = local_7f8._4_2_ - local_5b8._4_2_;
    sStack_842 = local_7f8._6_2_ - local_5b8._6_2_;
    sStack_840 = sStack_840 - CONCAT11(local_d78._4_1_,local_e98._4_1_);
    sStack_83e = uStack_7f0._2_2_ - uStack_5b0._2_2_;
    sStack_83c = uStack_7f0._4_2_ - uStack_5b0._4_2_;
    sStack_83a = uStack_7f0._6_2_ - uStack_5b0._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_eb8._1_1_,CONCAT11((char)local_d78,(undefined1)local_eb8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_eb8._2_1_,uVar10));
    uVar26 = CONCAT17(local_d78._3_1_,CONCAT16(local_eb8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_eb8._5_1_,CONCAT11(local_d78._4_1_,local_eb8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_eb8._6_1_,uVar15));
    uVar29 = CONCAT17(local_d78._7_1_,CONCAT16(local_eb8._7_1_,uVar16));
    local_858._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_858._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_858._6_2_ = (short)((ulong)uVar26 >> 0x30);
    uStack_850._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_850._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_850._6_2_ = (short)((ulong)uVar29 >> 0x30);
    local_8a8 = local_848 + CONCAT11((char)local_d78,(undefined1)local_eb8);
    local_858._2_2_ = sStack_846 + local_858._2_2_;
    local_858._4_2_ = sStack_844 + local_858._4_2_;
    local_858._6_2_ = sStack_842 + local_858._6_2_;
    sStack_8a0 = sStack_840 + CONCAT11(local_d78._4_1_,local_eb8._4_1_);
    uStack_850._2_2_ = sStack_83e + uStack_850._2_2_;
    uStack_850._4_2_ = sStack_83c + uStack_850._4_2_;
    uStack_850._6_2_ = sStack_83a + uStack_850._6_2_;
    local_868 = CONCAT26(local_838._6_2_,
                         CONCAT24(local_838._4_2_,CONCAT22(local_838._2_2_,local_888)));
    uStack_860 = CONCAT26(uStack_830._6_2_,
                          CONCAT24(uStack_830._4_2_,CONCAT22(uStack_830._2_2_,sStack_880)));
    local_878 = CONCAT26(local_858._6_2_,
                         CONCAT24(local_858._4_2_,CONCAT22(local_858._2_2_,local_8a8)));
    uStack_870 = CONCAT26(uStack_850._6_2_,
                          CONCAT24(uStack_850._4_2_,CONCAT22(uStack_850._2_2_,sStack_8a0)));
    local_1308 = local_888 + local_8a8;
    uStack_1306 = local_838._2_2_ + local_858._2_2_;
    uStack_1304 = local_838._4_2_ + local_858._4_2_;
    uStack_1302 = local_838._6_2_ + local_858._6_2_;
    sStack_1300 = sStack_880 + sStack_8a0;
    sStack_12fe = uStack_830._2_2_ + uStack_850._2_2_;
    sStack_12fc = uStack_830._4_2_ + uStack_850._4_2_;
    sStack_12fa = uStack_830._6_2_ + uStack_850._6_2_;
    local_e08 = CONCAT26(uStack_1302,CONCAT24(uStack_1304,CONCAT22(uStack_1306,local_1308)));
    uStack_e00 = CONCAT26(sStack_12fa,CONCAT24(sStack_12fc,CONCAT22(sStack_12fe,sStack_1300)));
    local_df8 = local_12f8;
    uStack_df0 = uStack_12f0;
    local_b68 = local_12f8;
    local_b6c = 3;
    uVar91 = (ushort)(sVar89 + sVar90) >> 3;
    uVar97 = (ushort)(local_7d8._2_2_ + local_7f8._2_2_) >> 3;
    uVar98 = (ushort)(local_7d8._4_2_ + local_7f8._4_2_) >> 3;
    uVar99 = (ushort)(local_7d8._6_2_ + local_7f8._6_2_) >> 3;
    uVar101 = local_1308 >> 3;
    uVar106 = uStack_1306 >> 3;
    uVar109 = uStack_1304 >> 3;
    uVar112 = uStack_1302 >> 3;
    local_12f8._0_4_ = CONCAT22(uVar97,uVar91);
    local_12f8._0_6_ = CONCAT24(uVar98,(undefined4)local_12f8);
    local_12f8 = CONCAT26(uVar99,(undefined6)local_12f8);
    uStack_12f0._0_4_ = CONCAT22(uVar106,uVar101);
    uStack_12f0._0_6_ = CONCAT24(uVar109,(undefined4)uStack_12f0);
    uStack_12f0 = CONCAT26(uVar112,(undefined6)uStack_12f0);
    local_58 = local_12f8;
    uStack_50 = uStack_12f0;
    local_68 = local_12f8;
    uStack_60 = uStack_12f0;
    local_1198 = (uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91);
    cStack_1197 = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
    cStack_1196 = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
    cStack_1195 = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    cStack_1194 = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
    cStack_1193 = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    cStack_1192 = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
    cStack_1191 = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
    cStack_1190 = (uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91);
    cStack_118f = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
    cStack_118e = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
    cStack_118d = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    cStack_118c = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
    cStack_118b = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    cStack_118a = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
    cStack_1189 = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
    local_5c8 = CONCAT26(local_838._6_2_,
                         CONCAT24(local_838._4_2_,CONCAT22(local_838._2_2_,local_888)));
    uStack_5c0 = CONCAT26(uStack_830._6_2_,
                          CONCAT24(uStack_830._4_2_,CONCAT22(uStack_830._2_2_,sStack_880)));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_e58._1_1_,CONCAT11((char)local_d78,(undefined1)local_e58)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_e58._2_1_,uVar10));
    uVar52 = CONCAT17(local_d78._3_1_,CONCAT16(local_e58._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_e58._5_1_,CONCAT11(local_d78._4_1_,local_e58._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_e58._6_1_,uVar15));
    uVar56 = CONCAT17(local_d78._7_1_,CONCAT16(local_e58._7_1_,uVar16));
    local_5d8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5d8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5d8._6_2_ = (short)((ulong)uVar52 >> 0x30);
    uStack_5d0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_5d0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_5d0._6_2_ = (short)((ulong)uVar56 >> 0x30);
    local_888 = local_888 - CONCAT11((char)local_d78,(undefined1)local_e58);
    sStack_886 = local_838._2_2_ - local_5d8._2_2_;
    sStack_884 = local_838._4_2_ - local_5d8._4_2_;
    sStack_882 = local_838._6_2_ - local_5d8._6_2_;
    sStack_880 = sStack_880 - CONCAT11(local_d78._4_1_,local_e58._4_1_);
    sStack_87e = uStack_830._2_2_ - uStack_5d0._2_2_;
    sStack_87c = uStack_830._4_2_ - uStack_5d0._4_2_;
    sStack_87a = uStack_830._6_2_ - uStack_5d0._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_f18._1_1_,CONCAT11((char)local_d78,(undefined1)local_f18)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_f18._2_1_,uVar10));
    uVar13 = CONCAT17(local_d78._3_1_,CONCAT16(local_f18._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_f18._5_1_,CONCAT11(local_d78._4_1_,local_f18._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_f18._6_1_,uVar15));
    uVar18 = CONCAT17(local_d78._7_1_,CONCAT16(local_f18._7_1_,uVar16));
    local_898._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_898._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_898._6_2_ = (short)((ulong)uVar13 >> 0x30);
    uStack_890._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_890._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_890._6_2_ = (short)((ulong)uVar18 >> 0x30);
    local_12d8 = local_888 + CONCAT11((char)local_d78,(undefined1)local_f18);
    sStack_12d6 = sStack_886 + local_898._2_2_;
    sStack_12d4 = sStack_884 + local_898._4_2_;
    sStack_12d2 = sStack_882 + local_898._6_2_;
    sStack_12d0 = sStack_880 + CONCAT11(local_d78._4_1_,local_f18._4_1_);
    sStack_12ce = sStack_87e + uStack_890._2_2_;
    sStack_12cc = sStack_87c + uStack_890._4_2_;
    sStack_12ca = sStack_87a + uStack_890._6_2_;
    local_5e8 = CONCAT26(local_858._6_2_,
                         CONCAT24(local_858._4_2_,CONCAT22(local_858._2_2_,local_8a8)));
    uStack_5e0 = CONCAT26(uStack_850._6_2_,
                          CONCAT24(uStack_850._4_2_,CONCAT22(uStack_850._2_2_,sStack_8a0)));
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_eb8._1_1_,CONCAT11((char)local_d78,(undefined1)local_eb8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_eb8._2_1_,uVar10));
    uVar27 = CONCAT17(local_d78._3_1_,CONCAT16(local_eb8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_eb8._5_1_,CONCAT11(local_d78._4_1_,local_eb8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_eb8._6_1_,uVar15));
    uVar30 = CONCAT17(local_d78._7_1_,CONCAT16(local_eb8._7_1_,uVar16));
    local_5f8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_5f8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_5f8._6_2_ = (short)((ulong)uVar27 >> 0x30);
    uStack_5f0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_5f0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_5f0._6_2_ = (short)((ulong)uVar30 >> 0x30);
    local_8a8 = local_8a8 - CONCAT11((char)local_d78,(undefined1)local_eb8);
    sStack_8a6 = local_858._2_2_ - local_5f8._2_2_;
    sStack_8a4 = local_858._4_2_ - local_5f8._4_2_;
    sStack_8a2 = local_858._6_2_ - local_5f8._6_2_;
    sStack_8a0 = sStack_8a0 - CONCAT11(local_d78._4_1_,local_eb8._4_1_);
    sStack_89e = uStack_850._2_2_ - uStack_5f0._2_2_;
    sStack_89c = uStack_850._4_2_ - uStack_5f0._4_2_;
    sStack_89a = uStack_850._6_2_ - uStack_5f0._6_2_;
    uVar10 = CONCAT13(local_d78._1_1_,
                      CONCAT12(local_ed8._1_1_,CONCAT11((char)local_d78,(undefined1)local_ed8)));
    uVar11 = CONCAT15(local_d78._2_1_,CONCAT14(local_ed8._2_1_,uVar10));
    uVar58 = CONCAT17(local_d78._3_1_,CONCAT16(local_ed8._3_1_,uVar11));
    uVar15 = CONCAT13(local_d78._5_1_,
                      CONCAT12(local_ed8._5_1_,CONCAT11(local_d78._4_1_,local_ed8._4_1_)));
    uVar16 = CONCAT15(local_d78._6_1_,CONCAT14(local_ed8._6_1_,uVar15));
    uVar60 = CONCAT17(local_d78._7_1_,CONCAT16(local_ed8._7_1_,uVar16));
    local_8b8._2_2_ = (short)((uint)uVar10 >> 0x10);
    local_8b8._4_2_ = (short)((uint6)uVar11 >> 0x20);
    local_8b8._6_2_ = (short)((ulong)uVar58 >> 0x30);
    uStack_8b0._2_2_ = (short)((uint)uVar15 >> 0x10);
    uStack_8b0._4_2_ = (short)((uint6)uVar16 >> 0x20);
    uStack_8b0._6_2_ = (short)((ulong)uVar60 >> 0x30);
    local_12e8 = local_8a8 + CONCAT11((char)local_d78,(undefined1)local_ed8);
    sStack_12e6 = sStack_8a6 + local_8b8._2_2_;
    sStack_12e4 = sStack_8a4 + local_8b8._4_2_;
    sStack_12e2 = sStack_8a2 + local_8b8._6_2_;
    sStack_12e0 = sStack_8a0 + CONCAT11(local_d78._4_1_,local_ed8._4_1_);
    sStack_12de = sStack_89e + uStack_8b0._2_2_;
    sStack_12dc = sStack_89c + uStack_8b0._4_2_;
    sStack_12da = sStack_89a + uStack_8b0._6_2_;
    local_8c8 = CONCAT26(sStack_12d2,CONCAT24(sStack_12d4,CONCAT22(sStack_12d6,local_12d8)));
    uStack_8c0 = CONCAT26(sStack_12ca,CONCAT24(sStack_12cc,CONCAT22(sStack_12ce,sStack_12d0)));
    local_8d8 = CONCAT26(sStack_12e2,CONCAT24(sStack_12e4,CONCAT22(sStack_12e6,local_12e8)));
    uStack_8d0 = CONCAT26(sStack_12da,CONCAT24(sStack_12dc,CONCAT22(sStack_12de,sStack_12e0)));
    local_1318 = local_12d8 + local_12e8;
    uStack_1316 = sStack_12d6 + sStack_12e6;
    uStack_1314 = sStack_12d4 + sStack_12e4;
    uStack_1312 = sStack_12d2 + sStack_12e2;
    sStack_1310 = sStack_12d0 + sStack_12e0;
    sStack_130e = sStack_12ce + sStack_12de;
    sStack_130c = sStack_12cc + sStack_12dc;
    sStack_130a = sStack_12ca + sStack_12da;
    local_e18 = CONCAT26(uStack_1322,CONCAT24(uStack_1324,CONCAT22(uStack_1326,local_1328)));
    uStack_e10 = CONCAT26(sStack_131a,CONCAT24(sStack_131c,CONCAT22(sStack_131e,sStack_1320)));
    local_e28 = CONCAT26(uStack_1312,CONCAT24(uStack_1314,CONCAT22(uStack_1316,local_1318)));
    uStack_e20 = CONCAT26(sStack_130a,CONCAT24(sStack_130c,CONCAT22(sStack_130e,sStack_1310)));
    local_b8c = 3;
    uVar91 = local_1328 >> 3;
    uVar97 = uStack_1326 >> 3;
    uVar98 = uStack_1324 >> 3;
    uVar99 = uStack_1322 >> 3;
    uVar101 = local_1318 >> 3;
    uVar106 = uStack_1316 >> 3;
    uVar109 = uStack_1314 >> 3;
    uVar112 = uStack_1312 >> 3;
    local_12f8._0_4_ = CONCAT22(uVar97,uVar91);
    local_12f8._0_6_ = CONCAT24(uVar98,(undefined4)local_12f8);
    local_12f8 = CONCAT26(uVar99,(undefined6)local_12f8);
    uStack_12f0._0_4_ = CONCAT22(uVar106,uVar101);
    uStack_12f0._0_6_ = CONCAT24(uVar109,(undefined4)uStack_12f0);
    uStack_12f0 = CONCAT26(uVar112,(undefined6)uStack_12f0);
    local_78 = local_12f8;
    uStack_70 = uStack_12f0;
    local_88 = local_12f8;
    uStack_80 = uStack_12f0;
    local_1228 = (uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91);
    cStack_1227 = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
    cStack_1226 = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
    cStack_1225 = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    cStack_1224 = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
    cStack_1223 = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    cStack_1222 = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
    cStack_1221 = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
    cStack_1220 = (uVar91 != 0) * (uVar91 < 0x100) * (char)uVar91 - (0xff < uVar91);
    cStack_121f = (uVar97 != 0) * (uVar97 < 0x100) * (char)uVar97 - (0xff < uVar97);
    cStack_121e = (uVar98 != 0) * (uVar98 < 0x100) * (char)uVar98 - (0xff < uVar98);
    cStack_121d = (uVar99 != 0) * (uVar99 < 0x100) * (char)uVar99 - (0xff < uVar99);
    cStack_121c = (uVar101 != 0) * (uVar101 < 0x100) * (char)uVar101 - (0xff < uVar101);
    cStack_121b = (uVar106 != 0) * (uVar106 < 0x100) * (char)uVar106 - (0xff < uVar106);
    cStack_121a = (uVar109 != 0) * (uVar109 < 0x100) * (char)uVar109 - (0xff < uVar109);
    cStack_1219 = (uVar112 != 0) * (uVar112 < 0x100) * (char)uVar112 - (0xff < uVar112);
    local_908 = CONCAT44(uStack_11a4,local_11a8);
    uStack_900 = CONCAT44(uStack_119c,uStack_11a0);
    local_8f8 = local_10e8._0_8_;
    uStack_8f0 = local_10e8._0_8_;
    local_1218 = ~local_10e8._0_8_ & local_908;
    uStack_1210 = ~local_10e8._0_8_ & uStack_900;
    local_ad8 = CONCAT17(cStack_1221,
                         CONCAT16(cStack_1222,
                                  CONCAT15(cStack_1223,
                                           CONCAT14(cStack_1224,
                                                    CONCAT13(cStack_1225,
                                                             CONCAT12(cStack_1226,
                                                                      CONCAT11(cStack_1227,
                                                                               local_1228)))))));
    uStack_ad0 = CONCAT17(cStack_1219,
                          CONCAT16(cStack_121a,
                                   CONCAT15(cStack_121b,
                                            CONCAT14(cStack_121c,
                                                     CONCAT13(cStack_121d,
                                                              CONCAT12(cStack_121e,
                                                                       CONCAT11(cStack_121f,
                                                                                cStack_1220)))))));
    local_ac8 = local_10e8._0_8_;
    uStack_ac0 = local_10e8._0_8_;
    local_1238 = local_10e8._0_8_ & local_ad8;
    uStack_1230 = local_10e8._0_8_ & uStack_ad0;
    uVar87 = uStack_1210 | uStack_1230;
    local_f18 = uVar8;
    local_ef8 = uVar7;
    local_ed8 = uVar6;
    local_eb8 = uVar5;
    local_e98 = uVar4;
    local_e78 = uVar3;
    local_e58 = uVar2;
    local_e38 = uVar1;
    local_d78 = uVar86;
    local_b88 = local_e18;
    uStack_b80 = local_e28;
    uStack_b60 = local_e08;
    local_b48 = local_dd8;
    local_968 = local_1238;
    uStack_960 = uStack_1230;
    local_958 = local_1218;
    uStack_950 = uStack_1210;
    local_8b8 = uVar58;
    uStack_8b0 = uVar60;
    local_898 = uVar13;
    uStack_890 = uVar18;
    local_858 = uVar26;
    uStack_850 = uVar29;
    local_838 = uVar12;
    uStack_830 = uVar17;
    local_7f8 = uVar35;
    uStack_7f0 = uVar41;
    local_7d8 = uVar9;
    uStack_7d0 = uVar14;
    local_798 = uVar44;
    uStack_790 = uVar47;
    local_778 = uVar57;
    uStack_770 = uVar59;
    local_738 = uVar50;
    uStack_730 = uVar54;
    local_718 = uVar25;
    uStack_710 = uVar28;
    local_708 = uVar32;
    uStack_700 = uVar38;
    local_6d8 = uVar19;
    uStack_6d0 = uVar22;
    local_6b8 = uVar62;
    uStack_6b0 = uVar65;
    local_6a8 = uVar31;
    uStack_6a0 = uVar37;
    local_698 = uVar43;
    uStack_690 = uVar46;
    local_678 = local_12c8;
    uStack_670 = uStack_12c0;
    local_638 = uVar49;
    uStack_630 = uVar53;
    local_628 = uVar61;
    uStack_620 = uVar64;
    local_608 = local_618;
    uStack_600 = uStack_610;
    local_5f8 = uVar27;
    uStack_5f0 = uVar30;
    local_5d8 = uVar52;
    uStack_5d0 = uVar56;
    local_5b8 = uVar36;
    uStack_5b0 = uVar42;
    local_598 = uVar63;
    uStack_590 = uVar66;
    local_578 = uVar45;
    uStack_570 = uVar48;
    local_558 = uVar21;
    uStack_550 = uVar24;
    local_538 = uVar51;
    uStack_530 = uVar55;
    local_518 = uVar20;
    uStack_510 = uVar23;
    local_28 = local_12c8;
    uStack_20 = uStack_12c0;
    *(ulong *)*local_1050 = local_1218 | local_1238;
    *(ulong *)(*pauVar84 + 8) = uVar87;
    *local_1058 = *local_1050 >> 0x20;
    puVar88 = local_1080;
    local_928 = *local_1080;
    uStack_920 = local_1080[1];
    local_918 = local_10e8._0_8_;
    uStack_910 = local_10e8._8_8_;
    local_1208 = ~local_10e8._0_8_ & local_928;
    uStack_1200 = ~local_10e8._8_8_ & uStack_920;
    local_af8 = CONCAT17(cStack_1191,
                         CONCAT16(cStack_1192,
                                  CONCAT15(cStack_1193,
                                           CONCAT14(cStack_1194,
                                                    CONCAT13(cStack_1195,
                                                             CONCAT12(cStack_1196,
                                                                      CONCAT11(cStack_1197,
                                                                               local_1198)))))));
    uStack_af0 = CONCAT17(cStack_1189,
                          CONCAT16(cStack_118a,
                                   CONCAT15(cStack_118b,
                                            CONCAT14(cStack_118c,
                                                     CONCAT13(cStack_118d,
                                                              CONCAT12(cStack_118e,
                                                                       CONCAT11(cStack_118f,
                                                                                cStack_1190)))))));
    local_ae8 = local_10e8._0_8_;
    uStack_ae0 = local_10e8._8_8_;
    local_11d8 = local_10e8._0_8_ & local_af8;
    uStack_11d0 = local_10e8._8_8_ & uStack_af0;
    uVar87 = uStack_1200 | uStack_11d0;
    local_988 = local_11d8;
    uStack_980 = uStack_11d0;
    local_978 = local_1208;
    uStack_970 = uStack_1200;
    *local_1080 = local_1208 | local_11d8;
    puVar88[1] = uVar87;
    puVar88 = local_1088;
    uVar87 = *local_1088;
    uVar92 = local_1088[1];
    local_938 = local_10e8._0_8_;
    uVar93 = local_938;
    uStack_930 = local_10e8._8_8_;
    uVar102 = uStack_930;
    local_938._0_4_ = (uint)local_10e8._0_8_;
    local_938._4_4_ = SUB84(local_10e8._0_8_,4);
    uStack_930._0_4_ = (uint)local_10e8._8_8_;
    uStack_930._4_4_ = SUB84(local_10e8._8_8_,4);
    local_948._0_4_ = (uint)uVar87;
    local_948._4_4_ = (uint)(uVar87 >> 0x20);
    uStack_940._0_4_ = (uint)uVar92;
    uStack_940._4_4_ = (uint)(uVar92 >> 0x20);
    local_11f8 = ((uint)local_938 ^ 0xffffffff) & (uint)local_948;
    uStack_11f4 = (local_938._4_4_ ^ 0xffffffff) & local_948._4_4_;
    uStack_11f0 = ((uint)uStack_930 ^ 0xffffffff) & (uint)uStack_940;
    uStack_11ec = (uStack_930._4_4_ ^ 0xffffffff) & uStack_940._4_4_;
    local_b18 = CONCAT17(cStack_1181,
                         CONCAT16(cStack_1182,
                                  CONCAT15(cStack_1183,
                                           CONCAT14(cStack_1184,
                                                    CONCAT13(cStack_1185,
                                                             CONCAT12(cStack_1186,
                                                                      CONCAT11(cStack_1187,
                                                                               local_1188)))))));
    uStack_b10 = CONCAT17(cStack_1179,
                          CONCAT16(cStack_117a,
                                   CONCAT15(cStack_117b,
                                            CONCAT14(cStack_117c,
                                                     CONCAT13(cStack_117d,
                                                              CONCAT12(cStack_117e,
                                                                       CONCAT11(cStack_117f,
                                                                                cStack_1180)))))));
    local_b08 = local_10e8._0_8_;
    uStack_b00 = local_10e8._8_8_;
    local_11e8 = local_10e8._0_8_ & local_b18;
    uStack_11e0 = local_10e8._8_8_ & uStack_b10;
    local_998 = CONCAT44(uStack_11f4,local_11f8);
    uStack_990 = CONCAT44(uStack_11ec,uStack_11f0);
    uVar103 = uStack_990 | uStack_11e0;
    local_9a8 = local_11e8;
    uStack_9a0 = uStack_11e0;
    local_948 = uVar87;
    uStack_940 = uVar92;
    local_938 = uVar93;
    uStack_930 = uVar102;
    *local_1088 = local_998 | local_11e8;
    puVar88[1] = uVar103;
    uVar86 = local_d78;
  }
  local_d78 = uVar86;
  v[0] = in_RSI;
  xx_storel_32((void *)((long)local_1348 - (long)(int)local_134c),v);
  v_00[1] = extraout_RDX;
  v_00[0] = in_RSI;
  xx_storel_32((void *)((long)local_1348 - (long)(int)(local_134c * 2)),v_00);
  v_01[1] = extraout_RDX_00;
  v_01[0] = in_RSI;
  xx_storel_32(local_1348,v_01);
  v_02[1] = extraout_RDX_01;
  v_02[0] = in_RSI;
  xx_storel_32((void *)((long)local_1348 + (long)(int)local_134c),v_02);
  v_03[1] = extraout_RDX_02;
  v_03[0] = in_RSI;
  xx_storel_32((void *)((long)local_1348 - (long)(int)(local_134c * 3)),v_03);
  v_04[1] = extraout_RDX_03;
  v_04[0] = in_RSI;
  xx_storel_32((void *)((long)local_1348 + (long)(int)(local_134c << 1)),v_04);
  return;
}

Assistant:

void aom_lpf_horizontal_8_sse2(unsigned char *s, int p,
                               const unsigned char *_blimit,
                               const unsigned char *_limit,
                               const unsigned char *_thresh) {
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;
  __m128i q1q0, p1p0;
  __m128i blimit = _mm_load_si128((const __m128i *)_blimit);
  __m128i limit = _mm_load_si128((const __m128i *)_limit);
  __m128i thresh = _mm_load_si128((const __m128i *)_thresh);

  p3 = xx_loadl_32(s - 4 * p);
  p2 = xx_loadl_32(s - 3 * p);
  p1 = xx_loadl_32(s - 2 * p);
  p0 = xx_loadl_32(s - 1 * p);
  q0 = xx_loadl_32(s - 0 * p);
  q1 = xx_loadl_32(s + 1 * p);
  q2 = xx_loadl_32(s + 2 * p);
  q3 = xx_loadl_32(s + 3 * p);

  lpf_internal_8_sse2(&p3, &q3, &p2, &q2, &p1, &q1, &p0, &q0, &q1q0, &p1p0,
                      &blimit, &limit, &thresh);

  xx_storel_32(s - 1 * p, p1p0);
  xx_storel_32(s - 2 * p, _mm_srli_si128(p1p0, 4));
  xx_storel_32(s + 0 * p, q1q0);
  xx_storel_32(s + 1 * p, _mm_srli_si128(q1q0, 4));
  xx_storel_32(s - 3 * p, p2);
  xx_storel_32(s + 2 * p, q2);
}